

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse2::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  GridSOA *pGVar19;
  Geometry *pGVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar33;
  long lVar34;
  long lVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  char *pcVar37;
  size_t sVar38;
  RTCRayN *pRVar39;
  Device *pDVar40;
  RTCFilterFunctionN p_Var41;
  int iVar42;
  Geometry *pGVar43;
  RTCIntersectArguments *pRVar44;
  int iVar45;
  uint uVar46;
  char *pcVar47;
  char *pcVar48;
  ulong uVar49;
  ulong uVar50;
  char *pcVar51;
  char *pcVar52;
  ulong uVar53;
  ulong uVar54;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar55;
  ulong uVar56;
  Primitive_conflict3 *prim;
  size_t sVar57;
  undefined4 uVar58;
  ulong unaff_R13;
  ulong uVar59;
  long lVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar86;
  float fVar87;
  float fVar88;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar77;
  undefined1 auVar78 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar85;
  float fVar89;
  float fVar90;
  float fVar112;
  float fVar113;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar114;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar141;
  float fVar150;
  float fVar152;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar156;
  float fVar170;
  float fVar171;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar172;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar173;
  float fVar185;
  float fVar186;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar187;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar193;
  float fVar194;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar196;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar202;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  int iVar233;
  float fVar234;
  float fVar235;
  int iVar236;
  int iStack_1310;
  undefined8 local_12d8;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  float local_1288;
  float fStack_1284;
  undefined8 local_1268;
  undefined8 uStack_1260;
  vbool<4> valid;
  undefined8 local_1238;
  undefined8 uStack_1230;
  Precalculations *local_1228;
  char *local_1220;
  ulong local_1218;
  ulong local_1210;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1188 [4];
  undefined1 local_1178 [16];
  float local_1168 [4];
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [16];
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined8 *local_1110;
  ulong local_1108;
  ulong local_1100;
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  ulong local_10b0;
  int local_10a8;
  int iStack_10a4;
  int iStack_10a0;
  int iStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  uint local_fc8;
  uint uStack_fc4;
  uint uStack_fc0;
  uint uStack_fbc;
  uint local_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar55 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar75 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar74 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar89 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar59 = uVar56 ^ 0x10;
  uVar49 = uVar54 ^ 0x10;
  iVar45 = (tray->tnear).field_0.i[k];
  iVar42 = (tray->tfar).field_0.i[k];
  auVar178._4_4_ = iVar42;
  auVar178._0_4_ = iVar42;
  auVar178._8_4_ = iVar42;
  auVar178._12_4_ = iVar42;
  local_1110 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1048 = fVar75;
  fStack_1044 = fVar75;
  fStack_1040 = fVar75;
  fStack_103c = fVar75;
  local_1058 = fVar74;
  fStack_1054 = fVar74;
  fStack_1050 = fVar74;
  fStack_104c = fVar74;
  local_1068 = fVar89;
  fStack_1064 = fVar89;
  fStack_1060 = fVar89;
  fStack_105c = fVar89;
  local_1078 = fVar76;
  fStack_1074 = fVar76;
  fStack_1070 = fVar76;
  fStack_106c = fVar76;
  local_1088 = fVar86;
  fStack_1084 = fVar86;
  fStack_1080 = fVar86;
  fStack_107c = fVar86;
  local_1098 = fVar87;
  fStack_1094 = fVar87;
  fStack_1090 = fVar87;
  fStack_108c = fVar87;
  local_1108 = uVar56;
  local_1100 = uVar59;
  local_10a8 = iVar45;
  iStack_10a4 = iVar45;
  iStack_10a0 = iVar45;
  iStack_109c = iVar45;
  local_10b0 = uVar49;
  fVar88 = fVar74;
  fVar90 = fVar74;
  fVar112 = fVar74;
  fVar113 = fVar89;
  fVar114 = fVar89;
  fVar141 = fVar89;
  fVar151 = fVar76;
  fVar153 = fVar76;
  fVar150 = fVar76;
  fVar155 = fVar86;
  fVar154 = fVar86;
  fVar188 = fVar86;
  fVar185 = fVar87;
  fVar193 = fVar87;
  fVar187 = fVar87;
  iVar42 = iVar45;
  iVar233 = iVar45;
  iVar236 = iVar45;
  fVar194 = fVar75;
  fVar195 = fVar75;
  fVar196 = fVar75;
  local_1228 = pre;
  while (pSVar55 != stack) {
    pSVar33 = pSVar55 + -1;
    pSVar55 = pSVar55 + -1;
    if ((float)pSVar33->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar33->dist == *(float *)(ray + k * 4 + 0x80)) {
      sVar57 = (pSVar55->ptr).ptr;
      do {
        if ((sVar57 & 8) == 0) {
          uVar36 = sVar57 & 0xfffffffffffffff0;
          fVar216 = *(float *)(ray + k * 4 + 0x70);
          pfVar9 = (float *)(uVar36 + 0x80 + uVar56);
          pfVar8 = (float *)(uVar36 + 0x20 + uVar56);
          auVar157._0_4_ = ((*pfVar9 * fVar216 + *pfVar8) - fVar75) * fVar76;
          auVar157._4_4_ = ((pfVar9[1] * fVar216 + pfVar8[1]) - fVar194) * fVar151;
          auVar157._8_4_ = ((pfVar9[2] * fVar216 + pfVar8[2]) - fVar195) * fVar153;
          auVar157._12_4_ = ((pfVar9[3] * fVar216 + pfVar8[3]) - fVar196) * fVar150;
          auVar115._4_4_ = iVar42;
          auVar115._0_4_ = iVar45;
          auVar115._8_4_ = iVar233;
          auVar115._12_4_ = iVar236;
          pfVar9 = (float *)(uVar36 + 0x80 + uVar50);
          pfVar8 = (float *)(uVar36 + 0x20 + uVar50);
          auVar115 = maxps(auVar115,auVar157);
          auVar176._0_4_ = ((*pfVar9 * fVar216 + *pfVar8) - fVar74) * fVar86;
          auVar176._4_4_ = ((pfVar9[1] * fVar216 + pfVar8[1]) - fVar88) * fVar155;
          auVar176._8_4_ = ((pfVar9[2] * fVar216 + pfVar8[2]) - fVar90) * fVar154;
          auVar176._12_4_ = ((pfVar9[3] * fVar216 + pfVar8[3]) - fVar112) * fVar188;
          pfVar9 = (float *)(uVar36 + 0x80 + uVar54);
          pfVar8 = (float *)(uVar36 + 0x20 + uVar54);
          auVar162._0_4_ = ((*pfVar9 * fVar216 + *pfVar8) - fVar89) * fVar87;
          auVar162._4_4_ = ((pfVar9[1] * fVar216 + pfVar8[1]) - fVar113) * fVar185;
          auVar162._8_4_ = ((pfVar9[2] * fVar216 + pfVar8[2]) - fVar114) * fVar193;
          auVar162._12_4_ = ((pfVar9[3] * fVar216 + pfVar8[3]) - fVar141) * fVar187;
          auVar157 = maxps(auVar176,auVar162);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar115,auVar157);
          pfVar9 = (float *)(uVar36 + 0x80 + uVar59);
          pfVar8 = (float *)(uVar36 + 0x20 + uVar59);
          auVar190._0_4_ = ((*pfVar9 * fVar216 + *pfVar8) - fVar75) * fVar76;
          auVar190._4_4_ = ((pfVar9[1] * fVar216 + pfVar8[1]) - fVar194) * fVar151;
          auVar190._8_4_ = ((pfVar9[2] * fVar216 + pfVar8[2]) - fVar195) * fVar153;
          auVar190._12_4_ = ((pfVar9[3] * fVar216 + pfVar8[3]) - fVar196) * fVar150;
          auVar115 = minps(auVar178,auVar190);
          pfVar10 = (float *)(uVar36 + 0x80 + (uVar50 ^ 0x10));
          pfVar8 = (float *)(uVar36 + 0x20 + (uVar50 ^ 0x10));
          pfVar11 = (float *)(uVar36 + 0x80 + uVar49);
          pfVar9 = (float *)(uVar36 + 0x20 + uVar49);
          auVar158._0_4_ = ((*pfVar10 * fVar216 + *pfVar8) - fVar74) * fVar86;
          auVar158._4_4_ = ((pfVar10[1] * fVar216 + pfVar8[1]) - fVar88) * fVar155;
          auVar158._8_4_ = ((pfVar10[2] * fVar216 + pfVar8[2]) - fVar90) * fVar154;
          auVar158._12_4_ = ((pfVar10[3] * fVar216 + pfVar8[3]) - fVar112) * fVar188;
          auVar174._0_4_ = ((*pfVar11 * fVar216 + *pfVar9) - fVar89) * fVar87;
          auVar174._4_4_ = ((pfVar11[1] * fVar216 + pfVar9[1]) - fVar113) * fVar185;
          auVar174._8_4_ = ((pfVar11[2] * fVar216 + pfVar9[2]) - fVar114) * fVar193;
          auVar174._12_4_ = ((pfVar11[3] * fVar216 + pfVar9[3]) - fVar141) * fVar187;
          auVar157 = minps(auVar158,auVar174);
          auVar115 = minps(auVar115,auVar157);
          if (((uint)sVar57 & 7) == 6) {
            bVar21 = (fVar216 < *(float *)(uVar36 + 0xf0) && *(float *)(uVar36 + 0xe0) <= fVar216)
                     && tNear.field_0._0_4_ <= auVar115._0_4_;
            bVar22 = (fVar216 < *(float *)(uVar36 + 0xf4) && *(float *)(uVar36 + 0xe4) <= fVar216)
                     && tNear.field_0._4_4_ <= auVar115._4_4_;
            bVar23 = (fVar216 < *(float *)(uVar36 + 0xf8) && *(float *)(uVar36 + 0xe8) <= fVar216)
                     && tNear.field_0._8_4_ <= auVar115._8_4_;
            bVar24 = (fVar216 < *(float *)(uVar36 + 0xfc) && *(float *)(uVar36 + 0xec) <= fVar216)
                     && tNear.field_0._12_4_ <= auVar115._12_4_;
          }
          else {
            bVar21 = tNear.field_0._0_4_ <= auVar115._0_4_;
            bVar22 = tNear.field_0._4_4_ <= auVar115._4_4_;
            bVar23 = tNear.field_0._8_4_ <= auVar115._8_4_;
            bVar24 = tNear.field_0._12_4_ <= auVar115._12_4_;
          }
          auVar91._0_4_ = (uint)bVar21 * -0x80000000;
          auVar91._4_4_ = (uint)bVar22 * -0x80000000;
          auVar91._8_4_ = (uint)bVar23 * -0x80000000;
          auVar91._12_4_ = (uint)bVar24 * -0x80000000;
          uVar58 = movmskps((int)unaff_R13,auVar91);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar58);
        }
        if ((sVar57 & 8) == 0) {
          if (unaff_R13 == 0) {
            iStack_1310 = 4;
          }
          else {
            uVar36 = sVar57 & 0xfffffffffffffff0;
            lVar60 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
              }
            }
            iStack_1310 = 0;
            sVar57 = *(size_t *)(uVar36 + lVar60 * 8);
            uVar53 = unaff_R13 - 1 & unaff_R13;
            if (uVar53 != 0) {
              uVar46 = tNear.field_0.i[lVar60];
              lVar60 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                }
              }
              sVar38 = *(size_t *)(uVar36 + lVar60 * 8);
              uVar17 = tNear.field_0.i[lVar60];
              uVar53 = uVar53 - 1 & uVar53;
              if (uVar53 == 0) {
                if (uVar46 < uVar17) {
                  (pSVar55->ptr).ptr = sVar38;
                  pSVar55->dist = uVar17;
                  pSVar55 = pSVar55 + 1;
                }
                else {
                  (pSVar55->ptr).ptr = sVar57;
                  pSVar55->dist = uVar46;
                  pSVar55 = pSVar55 + 1;
                  sVar57 = sVar38;
                }
              }
              else {
                auVar92._8_4_ = uVar46;
                auVar92._0_8_ = sVar57;
                auVar92._12_4_ = 0;
                auVar116._8_4_ = uVar17;
                auVar116._0_8_ = sVar38;
                auVar116._12_4_ = 0;
                lVar60 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                  }
                }
                uVar18 = *(ulong *)(uVar36 + lVar60 * 8);
                iVar15 = tNear.field_0.i[lVar60];
                auVar142._8_4_ = iVar15;
                auVar142._0_8_ = uVar18;
                auVar142._12_4_ = 0;
                auVar159._8_4_ = -(uint)((int)uVar46 < (int)uVar17);
                uVar53 = uVar53 - 1 & uVar53;
                if (uVar53 == 0) {
                  auVar159._4_4_ = auVar159._8_4_;
                  auVar159._0_4_ = auVar159._8_4_;
                  auVar159._12_4_ = auVar159._8_4_;
                  auVar115 = auVar92 & auVar159 | ~auVar159 & auVar116;
                  auVar157 = auVar116 & auVar159 | ~auVar159 & auVar92;
                  auVar160._8_4_ = -(uint)(auVar115._8_4_ < iVar15);
                  auVar160._0_8_ = CONCAT44(auVar160._8_4_,auVar160._8_4_);
                  auVar160._12_4_ = auVar160._8_4_;
                  sVar57 = ~auVar160._0_8_ & uVar18 | auVar115._0_8_ & auVar160._0_8_;
                  auVar115 = auVar142 & auVar160 | ~auVar160 & auVar115;
                  auVar93._8_4_ = -(uint)(auVar157._8_4_ < auVar115._8_4_);
                  auVar93._4_4_ = auVar93._8_4_;
                  auVar93._0_4_ = auVar93._8_4_;
                  auVar93._12_4_ = auVar93._8_4_;
                  *pSVar55 = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar93 & auVar157 | auVar115 & auVar93);
                  pSVar55[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                               (auVar157 & auVar93 | ~auVar93 & auVar115);
                  pSVar55 = pSVar55 + 2;
                }
                else {
                  lVar60 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                    }
                  }
                  iVar16 = tNear.field_0.i[lVar60];
                  auVar175._8_4_ = iVar16;
                  auVar175._0_8_ = *(undefined8 *)(uVar36 + lVar60 * 8);
                  auVar175._12_4_ = 0;
                  auVar161._4_4_ = auVar159._8_4_;
                  auVar161._0_4_ = auVar159._8_4_;
                  auVar161._8_4_ = auVar159._8_4_;
                  auVar161._12_4_ = auVar159._8_4_;
                  auVar115 = auVar92 & auVar161 | ~auVar161 & auVar116;
                  auVar157 = auVar116 & auVar161 | ~auVar161 & auVar92;
                  auVar189._0_4_ = -(uint)(iVar15 < iVar16);
                  auVar189._4_4_ = -(uint)(iVar15 < iVar16);
                  auVar189._8_4_ = -(uint)(iVar15 < iVar16);
                  auVar189._12_4_ = -(uint)(iVar15 < iVar16);
                  auVar162 = auVar142 & auVar189 | ~auVar189 & auVar175;
                  auVar190 = ~auVar189 & auVar142 | auVar175 & auVar189;
                  auVar143._8_4_ = -(uint)(auVar157._8_4_ < auVar190._8_4_);
                  auVar143._4_4_ = auVar143._8_4_;
                  auVar143._0_4_ = auVar143._8_4_;
                  auVar143._12_4_ = auVar143._8_4_;
                  auVar176 = auVar157 & auVar143 | ~auVar143 & auVar190;
                  auVar117._8_4_ = -(uint)(auVar115._8_4_ < auVar162._8_4_);
                  auVar117._0_8_ = CONCAT44(auVar117._8_4_,auVar117._8_4_);
                  auVar117._12_4_ = auVar117._8_4_;
                  sVar57 = auVar115._0_8_ & auVar117._0_8_ | ~auVar117._0_8_ & auVar162._0_8_;
                  auVar115 = ~auVar117 & auVar115 | auVar162 & auVar117;
                  auVar94._8_4_ = -(uint)(auVar115._8_4_ < auVar176._8_4_);
                  auVar94._4_4_ = auVar94._8_4_;
                  auVar94._0_4_ = auVar94._8_4_;
                  auVar94._12_4_ = auVar94._8_4_;
                  *pSVar55 = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar143 & auVar157 | auVar190 & auVar143);
                  pSVar55[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                               (~auVar94 & auVar115 | auVar176 & auVar94);
                  pSVar55[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                               (auVar115 & auVar94 | ~auVar94 & auVar176);
                  pSVar55 = pSVar55 + 3;
                }
              }
            }
          }
        }
        else {
          iStack_1310 = 6;
        }
      } while (iStack_1310 == 0);
      if (iStack_1310 == 6) {
        if (((uint)sVar57 & 0xf) == 8) {
          pGVar19 = (local_1228->super_Precalculations).grid;
          fVar89 = (float)(pGVar19->time_steps - 1);
          uVar46 = pGVar19->width;
          uVar56 = (ulong)uVar46;
          fVar74 = *(float *)(ray + k * 4 + 0x70) * fVar89;
          fVar75 = floorf(fVar74);
          uVar49 = local_10b0;
          fVar89 = fVar89 + -1.0;
          if (fVar89 <= fVar75) {
            fVar75 = fVar89;
          }
          fVar89 = 0.0;
          if (0.0 <= fVar75) {
            fVar89 = fVar75;
          }
          lVar60 = (long)(int)fVar89 * (ulong)pGVar19->gridBytes + (ulong)pGVar19->gridOffset;
          uVar59 = sVar57 >> 4;
          lVar34 = uVar59 * 4 + lVar60;
          pcVar5 = pGVar19->data + uVar59 * 4 + lVar60 + -4;
          fVar75 = *(float *)(pcVar5 + 4);
          pcVar37 = pGVar19->data + uVar56 * 4 + lVar34 + -4;
          fVar76 = *(float *)(pcVar37 + 4);
          fVar86 = *(float *)(pcVar5 + 8);
          fVar87 = *(float *)(pcVar37 + 8);
          if (uVar56 == 2) {
            fVar86 = fVar75;
            fVar87 = fVar76;
          }
          uVar53 = (ulong)pGVar19->dim_offset;
          uVar17 = pGVar19->height;
          uVar36 = (ulong)uVar17;
          lVar35 = uVar53 * 4 + lVar34;
          pcVar51 = pGVar19->data + lVar35 + -4;
          fVar88 = *(float *)(pGVar19->data + lVar35);
          pcVar1 = pcVar51 + uVar56 * 4;
          fVar90 = *(float *)(pcVar1 + 4);
          fVar112 = *(float *)(pGVar19->data + lVar35 + 4);
          fVar113 = *(float *)(pcVar1 + 8);
          if (uVar56 == 2) {
            fVar112 = fVar88;
            fVar113 = fVar90;
          }
          lVar35 = uVar53 * 8 + lVar34;
          pcVar47 = pGVar19->data + lVar35 + -4;
          fVar114 = *(float *)(pGVar19->data + lVar35);
          pcVar2 = pcVar47 + uVar56 * 4;
          fVar141 = *(float *)(pcVar2 + 4);
          fVar151 = *(float *)(pGVar19->data + lVar35 + 4);
          fVar153 = *(float *)(pcVar2 + 8);
          if (uVar56 == 2) {
            fVar151 = fVar114;
            fVar153 = fVar141;
          }
          lVar60 = uVar59 * 4 + lVar60 + 0x2c;
          uVar59 = (ulong)(pGVar19->gridBytes & 0xfffffffc);
          pcVar6 = pGVar19->data + uVar59 + lVar60 + -0x30;
          fVar150 = *(float *)(pcVar6 + 4);
          pcVar7 = pGVar19->data + uVar56 * 4 + uVar59 + lVar60 + -0x30;
          fVar155 = *(float *)(pcVar7 + 4);
          fVar154 = *(float *)(pcVar6 + 8);
          fVar188 = *(float *)(pcVar7 + 8);
          if (uVar56 == 2) {
            fVar154 = fVar150;
            fVar188 = fVar155;
          }
          pcVar52 = pcVar51 + uVar59;
          fVar185 = *(float *)(pcVar52 + 4);
          pcVar3 = pcVar52 + uVar56 * 4;
          fVar193 = *(float *)(pcVar3 + 4);
          fVar187 = *(float *)(pcVar52 + 8);
          fVar194 = *(float *)(pcVar3 + 8);
          if (uVar56 == 2) {
            fVar187 = fVar185;
            fVar194 = fVar193;
          }
          fVar74 = fVar74 - fVar89;
          pcVar48 = pcVar47 + uVar59;
          fVar89 = *(float *)(pcVar48 + 4);
          pcVar4 = pcVar48 + uVar56 * 4;
          fVar195 = *(float *)(pcVar4 + 4);
          fVar196 = *(float *)(pcVar48 + 8);
          fVar216 = *(float *)(pcVar4 + 8);
          if (uVar56 == 2) {
            fVar196 = fVar89;
            fVar216 = fVar195;
          }
          lVar60 = uVar53 * 0xc + lVar34;
          local_1220 = pGVar19->data + lVar60 + -4;
          local_1128 = 1.0 - fVar74;
          fStack_1124 = local_1128;
          fStack_1120 = local_1128;
          fStack_111c = local_1128;
          local_1288 = (float)*(undefined8 *)pcVar2;
          fStack_1284 = (float)((ulong)*(undefined8 *)pcVar2 >> 0x20);
          uStack_12a0._0_4_ = pGVar19->_geomID;
          uVar64 = pGVar19->_primID;
          fVar201 = *(float *)(ray + k * 4);
          fVar207 = *(float *)(ray + k * 4 + 0x10);
          fVar234 = *(float *)(ray + k * 4 + 0x20);
          fVar12 = *(float *)(ray + k * 4 + 0x40);
          local_10c8 = (*(float *)pcVar5 * local_1128 + *(float *)pcVar6 * fVar74) - fVar201;
          fStack_10c4 = (*(float *)pcVar37 * local_1128 + *(float *)pcVar7 * fVar74) - fVar201;
          fStack_10c0 = (fVar75 * local_1128 + fVar150 * fVar74) - fVar201;
          fStack_10bc = (fVar76 * local_1128 + fVar155 * fVar74) - fVar201;
          fVar212 = (*(float *)pcVar51 * local_1128 + *(float *)pcVar52 * fVar74) - fVar207;
          fVar213 = (*(float *)pcVar1 * local_1128 + *(float *)pcVar3 * fVar74) - fVar207;
          fVar214 = (fVar88 * local_1128 + fVar185 * fVar74) - fVar207;
          fVar215 = (fVar90 * local_1128 + fVar193 * fVar74) - fVar207;
          fVar156 = (*(float *)pcVar47 * local_1128 + *(float *)pcVar48 * fVar74) - fVar234;
          fVar170 = (*(float *)pcVar2 * local_1128 + *(float *)pcVar4 * fVar74) - fVar234;
          fVar171 = (fVar114 * local_1128 + fVar89 * fVar74) - fVar234;
          fVar172 = (fVar141 * local_1128 + fVar195 * fVar74) - fVar234;
          fVar140 = (fVar75 * local_1128 + fVar150 * fVar74) - fVar201;
          fVar150 = (fVar75 * local_1128 + fVar150 * fVar74) - fVar201;
          fVar152 = (fVar86 * local_1128 + fVar154 * fVar74) - fVar201;
          fVar154 = (fVar86 * local_1128 + fVar154 * fVar74) - fVar201;
          fVar173 = (fVar88 * local_1128 + fVar185 * fVar74) - fVar207;
          fVar185 = (fVar88 * local_1128 + fVar185 * fVar74) - fVar207;
          fVar186 = (fVar112 * local_1128 + fVar187 * fVar74) - fVar207;
          fVar187 = (fVar112 * local_1128 + fVar187 * fVar74) - fVar207;
          fVar208 = (fVar114 * local_1128 + fVar89 * fVar74) - fVar234;
          fVar209 = (fVar114 * local_1128 + fVar89 * fVar74) - fVar234;
          fVar210 = (fVar151 * local_1128 + fVar196 * fVar74) - fVar234;
          fVar211 = (fVar151 * local_1128 + fVar196 * fVar74) - fVar234;
          fVar196 = (*(float *)pcVar37 * local_1128 + *(float *)pcVar7 * fVar74) - fVar201;
          fVar199 = (fVar76 * local_1128 + fVar155 * fVar74) - fVar201;
          fVar200 = (fVar76 * local_1128 + fVar155 * fVar74) - fVar201;
          fVar201 = (fVar87 * local_1128 + fVar188 * fVar74) - fVar201;
          fVar202 = (*(float *)pcVar1 * local_1128 + *(float *)pcVar3 * fVar74) - fVar207;
          fVar205 = (fVar90 * local_1128 + fVar193 * fVar74) - fVar207;
          fVar206 = (fVar90 * local_1128 + fVar193 * fVar74) - fVar207;
          fVar207 = (fVar113 * local_1128 + fVar194 * fVar74) - fVar207;
          fVar227 = (local_1288 * local_1128 + *(float *)pcVar4 * fVar74) - fVar234;
          fVar229 = (fStack_1284 * local_1128 + fVar195 * fVar74) - fVar234;
          fVar231 = (fVar141 * local_1128 + fVar195 * fVar74) - fVar234;
          fVar234 = (fVar153 * local_1128 + fVar216 * fVar74) - fVar234;
          local_10d8._0_4_ = fVar196 - local_10c8;
          local_10d8._4_4_ = fVar199 - fStack_10c4;
          fStack_10d0 = fVar200 - fStack_10c0;
          fStack_10cc = fVar201 - fStack_10bc;
          local_10f8._0_4_ = fVar202 - fVar212;
          local_10f8._4_4_ = fVar205 - fVar213;
          fStack_10f0 = fVar206 - fVar214;
          fStack_10ec = fVar207 - fVar215;
          local_10e8 = fVar227 - fVar156;
          fStack_10e4 = fVar229 - fVar170;
          fStack_10e0 = fVar231 - fVar171;
          fStack_10dc = fVar234 - fVar172;
          fVar75 = *(float *)(ray + k * 4 + 0x50);
          fVar89 = *(float *)(ray + k * 4 + 0x60);
          fVar188 = local_10c8 - fVar140;
          fVar193 = fStack_10c4 - fVar150;
          fVar194 = fStack_10c0 - fVar152;
          fVar195 = fStack_10bc - fVar154;
          fVar223 = ((float)local_10f8._0_4_ * (fVar227 + fVar156) -
                    (fVar202 + fVar212) * local_10e8) * fVar12 +
                    ((fVar196 + local_10c8) * local_10e8 -
                    (fVar227 + fVar156) * (float)local_10d8._0_4_) * fVar75 +
                    ((float)local_10d8._0_4_ * (fVar202 + fVar212) -
                    (fVar196 + local_10c8) * (float)local_10f8._0_4_) * fVar89;
          fVar224 = ((float)local_10f8._4_4_ * (fVar229 + fVar170) -
                    (fVar205 + fVar213) * fStack_10e4) * fVar12 +
                    ((fVar199 + fStack_10c4) * fStack_10e4 -
                    (fVar229 + fVar170) * (float)local_10d8._4_4_) * fVar75 +
                    ((float)local_10d8._4_4_ * (fVar205 + fVar213) -
                    (fVar199 + fStack_10c4) * (float)local_10f8._4_4_) * fVar89;
          fVar225 = (fStack_10f0 * (fVar231 + fVar171) - (fVar206 + fVar214) * fStack_10e0) * fVar12
                    + ((fVar200 + fStack_10c0) * fStack_10e0 - (fVar231 + fVar171) * fStack_10d0) *
                      fVar75 + (fStack_10d0 * (fVar206 + fVar214) -
                               (fVar200 + fStack_10c0) * fStack_10f0) * fVar89;
          fVar226 = (fStack_10ec * (fVar234 + fVar172) - (fVar207 + fVar215) * fStack_10dc) * fVar12
                    + ((fVar201 + fStack_10bc) * fStack_10dc - (fVar234 + fVar172) * fStack_10cc) *
                      fVar75 + (fStack_10cc * (fVar207 + fVar215) -
                               (fVar201 + fStack_10bc) * fStack_10ec) * fVar89;
          fVar90 = fVar212 - fVar173;
          fVar112 = fVar213 - fVar185;
          fVar113 = fVar214 - fVar186;
          fVar114 = fVar215 - fVar187;
          local_f88 = fVar156 - fVar208;
          fStack_f84 = fVar170 - fVar209;
          fStack_f80 = fVar171 - fVar210;
          fStack_f7c = fVar172 - fVar211;
          local_f98 = (fVar90 * (fVar156 + fVar208) - (fVar212 + fVar173) * local_f88) * fVar12 +
                      ((local_10c8 + fVar140) * local_f88 - (fVar156 + fVar208) * fVar188) * fVar75
                      + (fVar188 * (fVar212 + fVar173) - (local_10c8 + fVar140) * fVar90) * fVar89;
          fStack_f94 = (fVar112 * (fVar170 + fVar209) - (fVar213 + fVar185) * fStack_f84) * fVar12 +
                       ((fStack_10c4 + fVar150) * fStack_f84 - (fVar170 + fVar209) * fVar193) *
                       fVar75 + (fVar193 * (fVar213 + fVar185) - (fStack_10c4 + fVar150) * fVar112)
                                * fVar89;
          fStack_f90 = (fVar113 * (fVar171 + fVar210) - (fVar214 + fVar186) * fStack_f80) * fVar12 +
                       ((fStack_10c0 + fVar152) * fStack_f80 - (fVar171 + fVar210) * fVar194) *
                       fVar75 + (fVar194 * (fVar214 + fVar186) - (fStack_10c0 + fVar152) * fVar113)
                                * fVar89;
          fStack_f8c = (fVar114 * (fVar172 + fVar211) - (fVar215 + fVar187) * fStack_f7c) * fVar12 +
                       ((fStack_10bc + fVar154) * fStack_f7c - (fVar172 + fVar211) * fVar195) *
                       fVar75 + (fVar195 * (fVar215 + fVar187) - (fStack_10bc + fVar154) * fVar114)
                                * fVar89;
          fVar216 = fVar140 - fVar196;
          fVar217 = fVar150 - fVar199;
          fVar219 = fVar152 - fVar200;
          fVar221 = fVar154 - fVar201;
          fVar141 = fVar173 - fVar202;
          fVar151 = fVar185 - fVar205;
          fVar153 = fVar186 - fVar206;
          fVar155 = fVar187 - fVar207;
          fVar76 = fVar208 - fVar227;
          fVar86 = fVar209 - fVar229;
          fVar87 = fVar210 - fVar231;
          fVar88 = fVar211 - fVar234;
          auVar118._0_4_ =
               (fVar141 * (fVar227 + fVar208) - (fVar202 + fVar173) * fVar76) * fVar12 +
               ((fVar196 + fVar140) * fVar76 - (fVar227 + fVar208) * fVar216) * fVar75 +
               (fVar216 * (fVar202 + fVar173) - (fVar196 + fVar140) * fVar141) * fVar89;
          auVar118._4_4_ =
               (fVar151 * (fVar229 + fVar209) - (fVar205 + fVar185) * fVar86) * fVar12 +
               ((fVar199 + fVar150) * fVar86 - (fVar229 + fVar209) * fVar217) * fVar75 +
               (fVar217 * (fVar205 + fVar185) - (fVar199 + fVar150) * fVar151) * fVar89;
          auVar118._8_4_ =
               (fVar153 * (fVar231 + fVar210) - (fVar206 + fVar186) * fVar87) * fVar12 +
               ((fVar200 + fVar152) * fVar87 - (fVar231 + fVar210) * fVar219) * fVar75 +
               (fVar219 * (fVar206 + fVar186) - (fVar200 + fVar152) * fVar153) * fVar89;
          auVar118._12_4_ =
               (fVar155 * (fVar234 + fVar211) - (fVar207 + fVar187) * fVar88) * fVar12 +
               ((fVar201 + fVar154) * fVar88 - (fVar234 + fVar211) * fVar221) * fVar75 +
               (fVar221 * (fVar207 + fVar187) - (fVar201 + fVar154) * fVar155) * fVar89;
          local_fa8._0_4_ = fVar223 + local_f98 + auVar118._0_4_;
          local_fa8._4_4_ = fVar224 + fStack_f94 + auVar118._4_4_;
          local_fa8._8_4_ = fVar225 + fStack_f90 + auVar118._8_4_;
          local_fa8._12_4_ = fVar226 + fStack_f8c + auVar118._12_4_;
          auVar177._4_4_ = fVar224;
          auVar177._0_4_ = fVar223;
          auVar177._8_4_ = fVar225;
          auVar177._12_4_ = fVar226;
          auVar26._4_4_ = fStack_f94;
          auVar26._0_4_ = local_f98;
          auVar26._8_4_ = fStack_f90;
          auVar26._12_4_ = fStack_f8c;
          auVar178 = minps(auVar177,auVar26);
          auVar115 = minps(auVar178,auVar118);
          local_12b8 = CONCAT44(fVar224,fVar223);
          uStack_12b0 = CONCAT44(fVar226,fVar225);
          auVar163._4_4_ = fVar224;
          auVar163._0_4_ = fVar223;
          auVar163._8_4_ = fVar225;
          auVar163._12_4_ = fVar226;
          auVar27._4_4_ = fStack_f94;
          auVar27._0_4_ = local_f98;
          auVar27._8_4_ = fStack_f90;
          auVar27._12_4_ = fStack_f8c;
          auVar178 = maxps(auVar163,auVar27);
          auVar178 = maxps(auVar178,auVar118);
          auVar164._4_4_ = -(uint)(auVar178._4_4_ <= ABS(local_fa8._4_4_) * 1.1920929e-07);
          auVar164._0_4_ = -(uint)(auVar178._0_4_ <= ABS(local_fa8._0_4_) * 1.1920929e-07);
          auVar164._8_4_ = -(uint)(auVar178._8_4_ <= ABS(local_fa8._8_4_) * 1.1920929e-07);
          auVar164._12_4_ = -(uint)(auVar178._12_4_ <= ABS(local_fa8._12_4_) * 1.1920929e-07);
          auVar179._4_4_ = -(uint)(-(ABS(local_fa8._4_4_) * 1.1920929e-07) <= auVar115._4_4_);
          auVar179._0_4_ = -(uint)(-(ABS(local_fa8._0_4_) * 1.1920929e-07) <= auVar115._0_4_);
          auVar179._8_4_ = -(uint)(-(ABS(local_fa8._8_4_) * 1.1920929e-07) <= auVar115._8_4_);
          auVar179._12_4_ = -(uint)(-(ABS(local_fa8._12_4_) * 1.1920929e-07) <= auVar115._12_4_);
          auVar164 = auVar164 | auVar179;
          iVar45 = movmskps((int)&local_1220,auVar164);
          local_1218 = uVar56;
          local_1210 = uVar36;
          if (iVar45 != 0) {
            uVar61 = -(uint)(ABS(fVar141 * local_f88) <= ABS(fVar90 * local_10e8));
            uVar65 = -(uint)(ABS(fVar151 * fStack_f84) <= ABS(fVar112 * fStack_10e4));
            uVar68 = -(uint)(ABS(fVar153 * fStack_f80) <= ABS(fVar113 * fStack_10e0));
            uVar71 = -(uint)(ABS(fVar155 * fStack_f7c) <= ABS(fVar114 * fStack_10dc));
            uVar62 = -(uint)(ABS(fVar188 * fVar76) <= ABS((float)local_10d8._0_4_ * local_f88));
            uVar66 = -(uint)(ABS(fVar193 * fVar86) <= ABS((float)local_10d8._4_4_ * fStack_f84));
            uVar69 = -(uint)(ABS(fVar194 * fVar87) <= ABS(fStack_10d0 * fStack_f80));
            uVar72 = -(uint)(ABS(fVar195 * fVar88) <= ABS(fStack_10cc * fStack_f7c));
            uVar63 = -(uint)(ABS(fVar216 * fVar90) <= ABS(fVar188 * (float)local_10f8._0_4_));
            uVar67 = -(uint)(ABS(fVar217 * fVar112) <= ABS(fVar193 * (float)local_10f8._4_4_));
            uVar70 = -(uint)(ABS(fVar219 * fVar113) <= ABS(fVar194 * fStack_10f0));
            uVar73 = -(uint)(ABS(fVar221 * fVar114) <= ABS(fVar195 * fStack_10ec));
            auVar95._0_4_ = (uint)(fVar90 * fVar76 - fVar141 * local_f88) & uVar61;
            auVar95._4_4_ = (uint)(fVar112 * fVar86 - fVar151 * fStack_f84) & uVar65;
            auVar95._8_4_ = (uint)(fVar113 * fVar87 - fVar153 * fStack_f80) & uVar68;
            auVar95._12_4_ = (uint)(fVar114 * fVar88 - fVar155 * fStack_f7c) & uVar71;
            auVar203._0_4_ =
                 ~uVar61 & (uint)((float)local_10f8._0_4_ * local_f88 - fVar90 * local_10e8);
            auVar203._4_4_ =
                 ~uVar65 & (uint)((float)local_10f8._4_4_ * fStack_f84 - fVar112 * fStack_10e4);
            auVar203._8_4_ = ~uVar68 & (uint)(fStack_10f0 * fStack_f80 - fVar113 * fStack_10e0);
            auVar203._12_4_ = ~uVar71 & (uint)(fStack_10ec * fStack_f7c - fVar114 * fStack_10dc);
            auVar203 = auVar203 | auVar95;
            auVar180._0_4_ =
                 ~uVar62 & (uint)(local_10e8 * fVar188 - (float)local_10d8._0_4_ * local_f88);
            auVar180._4_4_ =
                 ~uVar66 & (uint)(fStack_10e4 * fVar193 - (float)local_10d8._4_4_ * fStack_f84);
            auVar180._8_4_ = ~uVar69 & (uint)(fStack_10e0 * fVar194 - fStack_10d0 * fStack_f80);
            auVar180._12_4_ = ~uVar72 & (uint)(fStack_10dc * fVar195 - fStack_10cc * fStack_f7c);
            auVar28._4_4_ = (uint)(fVar217 * fStack_f84 - fVar193 * fVar86) & uVar66;
            auVar28._0_4_ = (uint)(fVar216 * local_f88 - fVar188 * fVar76) & uVar62;
            auVar28._8_4_ = (uint)(fVar219 * fStack_f80 - fVar194 * fVar87) & uVar69;
            auVar28._12_4_ = (uint)(fVar221 * fStack_f7c - fVar195 * fVar88) & uVar72;
            auVar180 = auVar180 | auVar28;
            fVar76 = (float)(~uVar63 & (uint)((float)local_10d8._0_4_ * fVar90 -
                                             fVar188 * (float)local_10f8._0_4_) |
                            (uint)(fVar188 * fVar141 - fVar216 * fVar90) & uVar63);
            fVar86 = (float)(~uVar67 & (uint)((float)local_10d8._4_4_ * fVar112 -
                                             fVar193 * (float)local_10f8._4_4_) |
                            (uint)(fVar193 * fVar151 - fVar217 * fVar112) & uVar67);
            fVar87 = (float)(~uVar70 & (uint)(fStack_10d0 * fVar113 - fVar194 * fStack_10f0) |
                            (uint)(fVar194 * fVar153 - fVar219 * fVar113) & uVar70);
            fVar88 = (float)(~uVar73 & (uint)(fStack_10cc * fVar114 - fVar195 * fStack_10ec) |
                            (uint)(fVar195 * fVar155 - fVar221 * fVar114) & uVar73);
            fVar90 = fVar12 * auVar203._0_4_ + fVar75 * auVar180._0_4_ + fVar89 * fVar76;
            fVar112 = fVar12 * auVar203._4_4_ + fVar75 * auVar180._4_4_ + fVar89 * fVar86;
            fVar113 = fVar12 * auVar203._8_4_ + fVar75 * auVar180._8_4_ + fVar89 * fVar87;
            fVar75 = fVar12 * auVar203._12_4_ + fVar75 * auVar180._12_4_ + fVar89 * fVar88;
            auVar197._0_4_ = fVar90 + fVar90;
            auVar197._4_4_ = fVar112 + fVar112;
            auVar197._8_4_ = fVar113 + fVar113;
            auVar197._12_4_ = fVar75 + fVar75;
            auVar119._0_4_ = fVar156 * fVar76;
            auVar119._4_4_ = fVar170 * fVar86;
            auVar119._8_4_ = fVar171 * fVar87;
            auVar119._12_4_ = fVar172 * fVar88;
            fVar90 = local_10c8 * auVar203._0_4_ + fVar212 * auVar180._0_4_ + auVar119._0_4_;
            fVar112 = fStack_10c4 * auVar203._4_4_ + fVar213 * auVar180._4_4_ + auVar119._4_4_;
            fVar141 = fStack_10c0 * auVar203._8_4_ + fVar214 * auVar180._8_4_ + auVar119._8_4_;
            fVar151 = fStack_10bc * auVar203._12_4_ + fVar215 * auVar180._12_4_ + auVar119._12_4_;
            auVar178 = rcpps(auVar119,auVar197);
            fVar75 = auVar178._0_4_;
            fVar89 = auVar178._4_4_;
            fVar113 = auVar178._8_4_;
            fVar114 = auVar178._12_4_;
            fVar90 = ((1.0 - auVar197._0_4_ * fVar75) * fVar75 + fVar75) * (fVar90 + fVar90);
            fVar112 = ((1.0 - auVar197._4_4_ * fVar89) * fVar89 + fVar89) * (fVar112 + fVar112);
            fVar113 = ((1.0 - auVar197._8_4_ * fVar113) * fVar113 + fVar113) * (fVar141 + fVar141);
            fVar114 = ((1.0 - auVar197._12_4_ * fVar114) * fVar114 + fVar114) * (fVar151 + fVar151);
            fVar75 = *(float *)(ray + k * 4 + 0x80);
            fVar89 = *(float *)(ray + k * 4 + 0x30);
            auVar120._0_4_ = -(uint)(fVar90 <= fVar75 && fVar89 <= fVar90) & auVar164._0_4_;
            auVar120._4_4_ = -(uint)(fVar112 <= fVar75 && fVar89 <= fVar112) & auVar164._4_4_;
            auVar120._8_4_ = -(uint)(fVar113 <= fVar75 && fVar89 <= fVar113) & auVar164._8_4_;
            auVar120._12_4_ = -(uint)(fVar114 <= fVar75 && fVar89 <= fVar114) & auVar164._12_4_;
            iVar45 = movmskps(iVar45,auVar120);
            if (iVar45 != 0) {
              aVar121._0_4_ = auVar120._0_4_ & -(uint)(auVar197._0_4_ != 0.0);
              aVar121._4_4_ = auVar120._4_4_ & -(uint)(auVar197._4_4_ != 0.0);
              aVar121._8_4_ = auVar120._8_4_ & -(uint)(auVar197._8_4_ != 0.0);
              aVar121._12_4_ = auVar120._12_4_ & -(uint)(auVar197._12_4_ != 0.0);
              iVar45 = movmskps(iVar45,(undefined1  [16])aVar121);
              if (iVar45 != 0) {
                tNear.field_0._8_8_ = uStack_12b0;
                tNear.field_0._0_8_ = local_12b8;
                local_1168[0] = fVar90;
                local_1168[1] = fVar112;
                local_1168[2] = fVar113;
                local_1168[3] = fVar114;
                _local_1158 = auVar203;
                local_1148 = auVar180;
                local_1138._4_4_ = fVar86;
                local_1138._0_4_ = fVar76;
                fStack_1130 = fVar87;
                fStack_112c = fVar88;
                pGVar20 = (context->scene->geometries).items[(uint)uStack_12a0].ptr;
                if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar178 = rcpps(local_fa8,local_fa8);
                  fVar75 = auVar178._0_4_;
                  fVar89 = auVar178._4_4_;
                  fVar76 = auVar178._8_4_;
                  fVar86 = auVar178._12_4_;
                  fVar75 = (float)(-(uint)(1e-18 <= ABS(local_fa8._0_4_)) &
                                  (uint)(((float)DAT_01feca10 - local_fa8._0_4_ * fVar75) * fVar75 +
                                        fVar75));
                  fVar89 = (float)(-(uint)(1e-18 <= ABS(local_fa8._4_4_)) &
                                  (uint)((DAT_01feca10._4_4_ - local_fa8._4_4_ * fVar89) * fVar89 +
                                        fVar89));
                  fVar76 = (float)(-(uint)(1e-18 <= ABS(local_fa8._8_4_)) &
                                  (uint)((DAT_01feca10._8_4_ - local_fa8._8_4_ * fVar76) * fVar76 +
                                        fVar76));
                  fVar86 = (float)(-(uint)(1e-18 <= ABS(local_fa8._12_4_)) &
                                  (uint)((DAT_01feca10._12_4_ - local_fa8._12_4_ * fVar86) * fVar86
                                        + fVar86));
                  auVar122._0_4_ = fVar223 * fVar75;
                  auVar122._4_4_ = fVar224 * fVar89;
                  auVar122._8_4_ = fVar225 * fVar76;
                  auVar122._12_4_ = fVar226 * fVar86;
                  auVar115 = minps(auVar122,_DAT_01feca10);
                  auVar96._0_4_ = fVar75 * local_f98;
                  auVar96._4_4_ = fVar89 * fStack_f94;
                  auVar96._8_4_ = fVar76 * fStack_f90;
                  auVar96._12_4_ = fVar86 * fStack_f8c;
                  auVar178 = minps(auVar96,_DAT_01feca10);
                  uVar61 = *(uint *)(pGVar19->data + lVar60);
                  pcVar5 = local_1220 + uVar56 * 4;
                  uVar62 = *(uint *)pcVar5;
                  uVar63 = *(uint *)(pcVar5 + 4);
                  uVar65 = *(uint *)(pGVar19->data + lVar60 + 4);
                  uVar66 = *(uint *)(pcVar5 + 8);
                  if (uVar56 == 2) {
                    uVar65 = uVar61;
                    uVar66 = uVar63;
                  }
                  fVar87 = auVar115._0_4_;
                  fVar88 = auVar115._4_4_;
                  fVar141 = auVar115._8_4_;
                  fVar151 = auVar115._12_4_;
                  fVar75 = auVar178._0_4_;
                  fVar89 = auVar178._4_4_;
                  fVar76 = auVar178._8_4_;
                  fVar86 = auVar178._12_4_;
                  fVar153 = (1.0 - fVar87) - fVar75;
                  fVar150 = (1.0 - fVar88) - fVar89;
                  fVar155 = (1.0 - fVar141) - fVar76;
                  fVar154 = (1.0 - fVar151) - fVar86;
                  local_1178._0_4_ =
                       fVar153 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                       (float)(uVar62 >> 0x10) * 0.00012207031 * fVar75 +
                       (float)(uVar61 >> 0x10) * 0.00012207031 * fVar87;
                  local_1178._4_4_ =
                       fVar150 * (float)(uVar62 >> 0x10) * 0.00012207031 +
                       (float)(uVar63 >> 0x10) * 0.00012207031 * fVar89 +
                       (float)(uVar61 >> 0x10) * 0.00012207031 * fVar88;
                  local_1178._8_4_ =
                       fVar155 * (float)(uVar61 >> 0x10) * 0.00012207031 +
                       (float)(uVar63 >> 0x10) * 0.00012207031 * fVar76 +
                       (float)(uVar65 >> 0x10) * 0.00012207031 * fVar141;
                  local_1178._12_4_ =
                       fVar154 * (float)(uVar63 >> 0x10) * 0.00012207031 +
                       (float)(uVar66 >> 0x10) * 0.00012207031 * fVar86 +
                       (float)(uVar65 >> 0x10) * 0.00012207031 * fVar151;
                  local_1188[1] =
                       (float)(uVar62 & 0xffff) * 0.00012207031 * fVar150 +
                       (float)(uVar63 & 0xffff) * 0.00012207031 * fVar89 +
                       (float)(uVar61 & 0xffff) * 0.00012207031 * fVar88;
                  local_1188[0] =
                       (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar153 +
                       (float)(uVar62 & 0xffff) * 0.00012207031 * fVar75 +
                       (float)(uVar61 & 0xffff) * 0.00012207031 * fVar87;
                  local_1188[2] =
                       (float)(uVar61 & 0xffff) * 0.00012207031 * fVar155 +
                       (float)(uVar63 & 0xffff) * 0.00012207031 * fVar76 +
                       (float)(uVar65 & 0xffff) * 0.00012207031 * fVar141;
                  local_1188[3] =
                       (float)(uVar63 & 0xffff) * 0.00012207031 * fVar154 +
                       (float)(uVar66 & 0xffff) * 0.00012207031 * fVar86 +
                       (float)(uVar65 & 0xffff) * 0.00012207031 * fVar151;
                  auVar31._4_4_ = fVar112;
                  auVar31._0_4_ = fVar90;
                  auVar31._8_4_ = fVar113;
                  auVar31._12_4_ = fVar114;
                  auVar115 = ~(undefined1  [16])aVar121 & _DAT_01feb9f0 |
                             auVar31 & (undefined1  [16])aVar121;
                  auVar144._4_4_ = auVar115._0_4_;
                  auVar144._0_4_ = auVar115._4_4_;
                  auVar144._8_4_ = auVar115._12_4_;
                  auVar144._12_4_ = auVar115._8_4_;
                  auVar178 = minps(auVar144,auVar115);
                  auVar97._0_8_ = auVar178._8_8_;
                  auVar97._8_4_ = auVar178._0_4_;
                  auVar97._12_4_ = auVar178._4_4_;
                  auVar178 = minps(auVar97,auVar178);
                  auVar98._0_8_ =
                       CONCAT44(-(uint)(auVar178._4_4_ == auVar115._4_4_) & aVar121._4_4_,
                                -(uint)(auVar178._0_4_ == auVar115._0_4_) & aVar121._0_4_);
                  auVar98._8_4_ = -(uint)(auVar178._8_4_ == auVar115._8_4_) & aVar121._8_4_;
                  auVar98._12_4_ = -(uint)(auVar178._12_4_ == auVar115._12_4_) & aVar121._12_4_;
                  iVar45 = movmskps(uVar46,auVar98);
                  aVar77 = aVar121;
                  if (iVar45 != 0) {
                    aVar77.i[2] = auVar98._8_4_;
                    aVar77._0_8_ = auVar98._0_8_;
                    aVar77.i[3] = auVar98._12_4_;
                  }
                  uVar61 = movmskps(iVar45,(undefined1  [16])aVar77);
                  lVar60 = 0;
                  if (uVar61 != 0) {
                    for (; (uVar61 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                    }
                  }
                  valid.field_0 = aVar121;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar75 = local_1188[lVar60];
                    fVar89 = local_1168[lVar60 + -4];
                    uVar58 = *(undefined4 *)(local_1158 + lVar60 * 4);
                    uVar13 = *(undefined4 *)(local_1148 + lVar60 * 4);
                    uVar14 = *(undefined4 *)(local_1138 + lVar60 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_1168[lVar60];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar58;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                    *(float *)(ray + k * 4 + 0xf0) = fVar75;
                    *(float *)(ray + k * 4 + 0x100) = fVar89;
                    *(uint *)(ray + k * 4 + 0x110) = uVar64;
                    *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_12a0;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_12a8 = CONCAT44((uint)uStack_12a0,(uint)uStack_12a0);
                    uStack_12a0._4_4_ = (uint)uStack_12a0;
                    local_12d8 = CONCAT44(uVar64,uVar64);
                    uVar29 = *local_1110;
                    uVar30 = local_1110[1];
                    do {
                      uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_1008 = local_1188[lVar60];
                      fVar75 = local_1168[lVar60 + -4];
                      *(float *)(ray + k * 4 + 0x80) = local_1168[lVar60];
                      args.context = context->user;
                      local_ff8._4_4_ = fVar75;
                      local_ff8._0_4_ = fVar75;
                      local_ff8._8_4_ = fVar75;
                      local_ff8._12_4_ = fVar75;
                      local_1038 = *(undefined4 *)(local_1158 + lVar60 * 4);
                      uVar13 = *(undefined4 *)(local_1148 + lVar60 * 4);
                      uVar14 = *(undefined4 *)(local_1138 + lVar60 * 4);
                      local_1028._4_4_ = uVar13;
                      local_1028._0_4_ = uVar13;
                      local_1028._8_4_ = uVar13;
                      local_1028._12_4_ = uVar13;
                      local_1018._4_4_ = uVar14;
                      local_1018._0_4_ = uVar14;
                      local_1018._8_4_ = uVar14;
                      local_1018._12_4_ = uVar14;
                      uStack_1034 = local_1038;
                      uStack_1030 = local_1038;
                      uStack_102c = local_1038;
                      fStack_1004 = local_1008;
                      fStack_1000 = local_1008;
                      fStack_ffc = local_1008;
                      local_fe8 = local_12d8;
                      uStack_fe0 = CONCAT44(uVar64,uVar64);
                      local_fd8 = local_12a8;
                      uStack_fd0 = uStack_12a0;
                      local_fc8 = (args.context)->instID[0];
                      uStack_fc4 = local_fc8;
                      uStack_fc0 = local_fc8;
                      uStack_fbc = local_fc8;
                      local_fb8 = (args.context)->instPrimID[0];
                      uStack_fb4 = local_fb8;
                      uStack_fb0 = local_fb8;
                      uStack_fac = local_fb8;
                      args.valid = (int *)&local_1238;
                      pGVar43 = (Geometry *)pGVar20->userPtr;
                      args.hit = (RTCHitN *)&local_1038;
                      args.N = 4;
                      p_Var41 = pGVar20->intersectionFilterN;
                      local_1238 = uVar29;
                      uStack_1230 = uVar30;
                      args.geometryUserPtr = pGVar43;
                      args.ray = (RTCRayN *)ray;
                      if (p_Var41 != (RTCFilterFunctionN)0x0) {
                        p_Var41 = (RTCFilterFunctionN)(*p_Var41)(&args);
                      }
                      auVar80._0_4_ = -(uint)((int)local_1238 == 0);
                      auVar80._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar80._8_4_ = -(uint)((int)uStack_1230 == 0);
                      auVar80._12_4_ = -(uint)(uStack_1230._4_4_ == 0);
                      uVar61 = movmskps((int)p_Var41,auVar80);
                      pRVar39 = (RTCRayN *)(ulong)(uVar61 ^ 0xf);
                      if ((uVar61 ^ 0xf) == 0) {
                        auVar80 = auVar80 ^ _DAT_01febe20;
                      }
                      else {
                        pGVar43 = (Geometry *)context->args;
                        pDVar40 = pGVar43->device;
                        if ((pDVar40 != (Device *)0x0) &&
                           ((((ulong)(pGVar43->super_RefCount)._vptr_RefCount & 2) != 0 ||
                            (pGVar43 = pGVar20, ((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          pDVar40 = (Device *)(*(code *)pDVar40)(&args);
                        }
                        auVar102._0_4_ = -(uint)((int)local_1238 == 0);
                        auVar102._4_4_ = -(uint)(local_1238._4_4_ == 0);
                        auVar102._8_4_ = -(uint)((int)uStack_1230 == 0);
                        auVar102._12_4_ = -(uint)(uStack_1230._4_4_ == 0);
                        auVar80 = auVar102 ^ _DAT_01febe20;
                        uVar61 = movmskps((int)pDVar40,auVar102);
                        pRVar39 = (RTCRayN *)(ulong)(uVar61 ^ 0xf);
                        if ((uVar61 ^ 0xf) != 0) {
                          auVar128._0_4_ = *(uint *)(args.ray + 0xc0) & auVar102._0_4_;
                          auVar128._4_4_ = *(uint *)(args.ray + 0xc4) & auVar102._4_4_;
                          auVar128._8_4_ = *(uint *)(args.ray + 200) & auVar102._8_4_;
                          auVar128._12_4_ = *(uint *)(args.ray + 0xcc) & auVar102._12_4_;
                          auVar191._0_4_ = ~auVar102._0_4_ & *(uint *)args.hit;
                          auVar191._4_4_ = ~auVar102._4_4_ & *(uint *)(args.hit + 4);
                          auVar191._8_4_ = ~auVar102._8_4_ & *(uint *)(args.hit + 8);
                          auVar191._12_4_ = ~auVar102._12_4_ & *(uint *)(args.hit + 0xc);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar191 | auVar128;
                          uVar61 = *(uint *)(args.hit + 0x14);
                          uVar62 = *(uint *)(args.hit + 0x18);
                          uVar63 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar102._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar102._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar102._4_4_ & uVar61 |
                               *(uint *)(args.ray + 0xd4) & auVar102._4_4_;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar102._8_4_ & uVar62 |
                               *(uint *)(args.ray + 0xd8) & auVar102._8_4_;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar102._12_4_ & uVar63 |
                               *(uint *)(args.ray + 0xdc) & auVar102._12_4_;
                          auVar168._0_4_ = *(uint *)(args.ray + 0xe0) & auVar102._0_4_;
                          auVar168._4_4_ = *(uint *)(args.ray + 0xe4) & auVar102._4_4_;
                          auVar168._8_4_ = *(uint *)(args.ray + 0xe8) & auVar102._8_4_;
                          auVar168._12_4_ = *(uint *)(args.ray + 0xec) & auVar102._12_4_;
                          auVar129._0_4_ = ~auVar102._0_4_ & *(uint *)(args.hit + 0x20);
                          auVar129._4_4_ = ~auVar102._4_4_ & *(uint *)(args.hit + 0x24);
                          auVar129._8_4_ = ~auVar102._8_4_ & *(uint *)(args.hit + 0x28);
                          auVar129._12_4_ = ~auVar102._12_4_ & *(uint *)(args.hit + 0x2c);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar129 | auVar168;
                          auVar183._0_4_ = *(uint *)(args.ray + 0xf0) & auVar102._0_4_;
                          auVar183._4_4_ = *(uint *)(args.ray + 0xf4) & auVar102._4_4_;
                          auVar183._8_4_ = *(uint *)(args.ray + 0xf8) & auVar102._8_4_;
                          auVar183._12_4_ = *(uint *)(args.ray + 0xfc) & auVar102._12_4_;
                          auVar130._0_4_ = ~auVar102._0_4_ & *(uint *)(args.hit + 0x30);
                          auVar130._4_4_ = ~auVar102._4_4_ & *(uint *)(args.hit + 0x34);
                          auVar130._8_4_ = ~auVar102._8_4_ & *(uint *)(args.hit + 0x38);
                          auVar130._12_4_ = ~auVar102._12_4_ & *(uint *)(args.hit + 0x3c);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar130 | auVar183;
                          uVar61 = *(uint *)(args.hit + 0x44);
                          uVar62 = *(uint *)(args.hit + 0x48);
                          uVar63 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar102._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar102._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar102._4_4_ & uVar61 |
                               *(uint *)(args.ray + 0x104) & auVar102._4_4_;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar102._8_4_ & uVar62 |
                               *(uint *)(args.ray + 0x108) & auVar102._8_4_;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar102._12_4_ & uVar63 |
                               *(uint *)(args.ray + 0x10c) & auVar102._12_4_;
                          uVar61 = *(uint *)(args.hit + 0x54);
                          uVar62 = *(uint *)(args.hit + 0x58);
                          uVar63 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar102._0_4_ |
                               ~auVar102._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar102._4_4_ |
                               ~auVar102._4_4_ & uVar61;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar102._8_4_ |
                               ~auVar102._8_4_ & uVar62;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar102._12_4_ |
                               ~auVar102._12_4_ & uVar63;
                          uVar61 = *(uint *)(args.hit + 100);
                          uVar62 = *(uint *)(args.hit + 0x68);
                          uVar63 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar102._0_4_ |
                               ~auVar102._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar102._4_4_ |
                               ~auVar102._4_4_ & uVar61;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar102._8_4_ |
                               ~auVar102._8_4_ & uVar62;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar102._12_4_ |
                               ~auVar102._12_4_ & uVar63;
                          auVar131._0_4_ = *(uint *)(args.ray + 0x130) & auVar102._0_4_;
                          auVar131._4_4_ = *(uint *)(args.ray + 0x134) & auVar102._4_4_;
                          auVar131._8_4_ = *(uint *)(args.ray + 0x138) & auVar102._8_4_;
                          auVar131._12_4_ = *(uint *)(args.ray + 0x13c) & auVar102._12_4_;
                          auVar146._0_4_ = ~auVar102._0_4_ & *(uint *)(args.hit + 0x70);
                          auVar146._4_4_ = ~auVar102._4_4_ & *(uint *)(args.hit + 0x74);
                          auVar146._8_4_ = ~auVar102._8_4_ & *(uint *)(args.hit + 0x78);
                          auVar146._12_4_ = ~auVar102._12_4_ & *(uint *)(args.hit + 0x7c);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar146 | auVar131;
                          auVar132._0_4_ = *(uint *)(args.ray + 0x140) & auVar102._0_4_;
                          auVar132._4_4_ = *(uint *)(args.ray + 0x144) & auVar102._4_4_;
                          auVar132._8_4_ = *(uint *)(args.ray + 0x148) & auVar102._8_4_;
                          auVar132._12_4_ = *(uint *)(args.ray + 0x14c) & auVar102._12_4_;
                          auVar103._0_4_ = ~auVar102._0_4_ & *(uint *)(args.hit + 0x80);
                          auVar103._4_4_ = ~auVar102._4_4_ & *(uint *)(args.hit + 0x84);
                          auVar103._8_4_ = ~auVar102._8_4_ & *(uint *)(args.hit + 0x88);
                          auVar103._12_4_ = ~auVar102._12_4_ & *(uint *)(args.hit + 0x8c);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar103 | auVar132;
                          pRVar39 = args.ray;
                          pGVar43 = (Geometry *)args.hit;
                        }
                      }
                      auVar81._0_4_ = auVar80._0_4_ << 0x1f;
                      auVar81._4_4_ = auVar80._4_4_ << 0x1f;
                      auVar81._8_4_ = auVar80._8_4_ << 0x1f;
                      auVar81._12_4_ = auVar80._12_4_ << 0x1f;
                      iVar45 = movmskps((int)pRVar39,auVar81);
                      if (iVar45 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar58;
                      }
                      valid.field_0.v[lVar60] = 0.0;
                      fVar75 = *(float *)(ray + k * 4 + 0x80);
                      valid.field_0.i[0] = -(uint)(fVar90 <= fVar75) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(fVar112 <= fVar75) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(fVar113 <= fVar75) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(fVar114 <= fVar75) & valid.field_0.i[3];
                      iVar45 = movmskps(iVar45,(undefined1  [16])valid.field_0);
                      if (iVar45 != 0) {
                        auVar104._0_4_ = valid.field_0.i[0] & (uint)fVar90;
                        auVar104._4_4_ = valid.field_0.i[1] & (uint)fVar112;
                        auVar104._8_4_ = valid.field_0.i[2] & (uint)fVar113;
                        auVar104._12_4_ = valid.field_0.i[3] & (uint)fVar114;
                        auVar133._0_8_ =
                             CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                        auVar133._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                        auVar133._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                        auVar133 = auVar133 | auVar104;
                        auVar147._4_4_ = auVar133._0_4_;
                        auVar147._0_4_ = auVar133._4_4_;
                        auVar147._8_4_ = auVar133._12_4_;
                        auVar147._12_4_ = auVar133._8_4_;
                        auVar178 = minps(auVar147,auVar133);
                        auVar105._0_8_ = auVar178._8_8_;
                        auVar105._8_4_ = auVar178._0_4_;
                        auVar105._12_4_ = auVar178._4_4_;
                        auVar178 = minps(auVar105,auVar178);
                        auVar106._0_8_ =
                             CONCAT44(-(uint)(auVar178._4_4_ == auVar133._4_4_) & valid.field_0.i[1]
                                      ,-(uint)(auVar178._0_4_ == auVar133._0_4_) &
                                       valid.field_0.i[0]);
                        auVar106._8_4_ =
                             -(uint)(auVar178._8_4_ == auVar133._8_4_) & valid.field_0.i[2];
                        auVar106._12_4_ =
                             -(uint)(auVar178._12_4_ == auVar133._12_4_) & valid.field_0.i[3];
                        iVar42 = movmskps((int)pGVar43,auVar106);
                        aVar82 = valid.field_0;
                        if (iVar42 != 0) {
                          aVar82.i[2] = auVar106._8_4_;
                          aVar82._0_8_ = auVar106._0_8_;
                          aVar82.i[3] = auVar106._12_4_;
                        }
                        uVar58 = movmskps(iVar42,(undefined1  [16])aVar82);
                        uVar59 = CONCAT44((int)((ulong)pGVar43 >> 0x20),uVar58);
                        lVar60 = 0;
                        if (uVar59 != 0) {
                          for (; (uVar59 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                          }
                        }
                      }
                    } while ((char)iVar45 != '\0');
                  }
                }
              }
            }
          }
          if (2 < uVar17) {
            lVar34 = uVar56 * 4 + lVar34;
            pcVar37 = pGVar19->data + lVar34 + -4;
            fVar75 = *(float *)(pGVar19->data + lVar34);
            pcVar5 = pcVar37 + uVar56 * 4;
            fVar89 = *(float *)(pcVar5 + 4);
            fVar76 = *(float *)(pGVar19->data + lVar34 + 4);
            fVar86 = *(float *)(pcVar5 + 8);
            if (uVar56 == 2) {
              fVar76 = fVar75;
              fVar86 = fVar89;
            }
            pGVar19 = (local_1228->super_Precalculations).grid;
            uVar59 = (ulong)pGVar19->dim_offset;
            pcVar1 = pcVar37 + uVar59 * 4;
            fVar87 = *(float *)(pcVar1 + 4);
            pcVar51 = pcVar1 + uVar56 * 4;
            fVar88 = *(float *)(pcVar51 + 4);
            fVar90 = *(float *)(pcVar51 + 8);
            fVar112 = *(float *)(pcVar1 + 8);
            if (uVar56 == 2) {
              fVar90 = fVar88;
              fVar112 = fVar87;
            }
            pcVar2 = pcVar37 + uVar59 * 8;
            fVar113 = *(float *)(pcVar2 + 4);
            pcVar47 = pcVar2 + uVar56 * 4;
            fVar114 = *(float *)(pcVar47 + 4);
            fVar141 = *(float *)(pcVar2 + 8);
            fVar151 = *(float *)(pcVar47 + 8);
            if (uVar56 == 2) {
              fVar141 = fVar113;
              fVar151 = fVar114;
            }
            uVar53 = (ulong)(pGVar19->gridBytes & 0xfffffffc);
            pcVar6 = pcVar37 + uVar53;
            fVar153 = *(float *)(pcVar6 + 4);
            pcVar7 = pcVar37 + uVar56 * 4 + uVar53;
            fVar150 = *(float *)(pcVar7 + 4);
            fVar155 = *(float *)(pcVar6 + 8);
            fVar154 = *(float *)(pcVar7 + 8);
            if (uVar56 == 2) {
              fVar155 = fVar153;
              fVar154 = fVar150;
            }
            pcVar52 = pcVar1 + uVar53;
            fVar188 = *(float *)(pcVar52 + 4);
            pcVar3 = pcVar52 + uVar56 * 4;
            fVar185 = *(float *)(pcVar3 + 4);
            fVar193 = *(float *)(pcVar52 + 8);
            fVar187 = *(float *)(pcVar3 + 8);
            if (uVar56 == 2) {
              fVar193 = fVar188;
              fVar187 = fVar185;
            }
            pcVar48 = pcVar2 + uVar53;
            fVar194 = *(float *)(pcVar48 + 4);
            pcVar4 = pcVar48 + uVar56 * 4;
            fVar195 = *(float *)(pcVar4 + 4);
            fVar196 = *(float *)(pcVar48 + 8);
            fVar216 = *(float *)(pcVar4 + 8);
            if (uVar56 == 2) {
              fVar196 = fVar194;
              fVar216 = fVar195;
            }
            local_1220 = pcVar37 + uVar59 * 0xc;
            uVar17 = pGVar19->_geomID;
            uStack_1260._0_4_ = pGVar19->_primID;
            fVar201 = *(float *)(ray + k * 4);
            fVar207 = *(float *)(ray + k * 4 + 0x10);
            fVar234 = *(float *)(ray + k * 4 + 0x20);
            fVar12 = *(float *)(ray + k * 4 + 0x40);
            fVar140 = *(float *)(ray + k * 4 + 0x50);
            fVar170 = (*(float *)pcVar37 * local_1128 + *(float *)pcVar6 * fVar74) - fVar201;
            fVar171 = (*(float *)pcVar5 * fStack_1124 + *(float *)pcVar7 * fVar74) - fVar201;
            fVar172 = (fVar75 * fStack_1120 + fVar153 * fVar74) - fVar201;
            fVar173 = (fVar89 * fStack_111c + fVar150 * fVar74) - fVar201;
            local_10c8 = (*(float *)pcVar1 * local_1128 + *(float *)pcVar52 * fVar74) - fVar207;
            fStack_10c4 = (*(float *)pcVar51 * fStack_1124 + *(float *)pcVar3 * fVar74) - fVar207;
            fStack_10c0 = (fVar87 * fStack_1120 + fVar188 * fVar74) - fVar207;
            fStack_10bc = (fVar88 * fStack_111c + fVar185 * fVar74) - fVar207;
            fVar228 = (*(float *)pcVar2 * local_1128 + *(float *)pcVar48 * fVar74) - fVar234;
            fVar230 = (*(float *)pcVar47 * fStack_1124 + *(float *)pcVar4 * fVar74) - fVar234;
            fVar232 = (fVar113 * fStack_1120 + fVar194 * fVar74) - fVar234;
            fVar235 = (fVar114 * fStack_111c + fVar195 * fVar74) - fVar234;
            fVar152 = (fVar75 * local_1128 + fVar153 * fVar74) - fVar201;
            fVar153 = (fVar75 * fStack_1124 + fVar153 * fVar74) - fVar201;
            fVar156 = (fVar76 * fStack_1120 + fVar155 * fVar74) - fVar201;
            fVar155 = (fVar76 * fStack_111c + fVar155 * fVar74) - fVar201;
            fVar214 = (fVar87 * local_1128 + fVar188 * fVar74) - fVar207;
            fVar215 = (fVar87 * fStack_1124 + fVar188 * fVar74) - fVar207;
            fVar217 = (fVar112 * fStack_1120 + fVar193 * fVar74) - fVar207;
            fVar219 = (fVar112 * fStack_111c + fVar193 * fVar74) - fVar207;
            fVar186 = (fVar113 * local_1128 + fVar194 * fVar74) - fVar234;
            fVar199 = (fVar113 * fStack_1124 + fVar194 * fVar74) - fVar234;
            fVar202 = (fVar141 * fStack_1120 + fVar196 * fVar74) - fVar234;
            fVar208 = (fVar141 * fStack_111c + fVar196 * fVar74) - fVar234;
            fVar211 = (*(float *)pcVar5 * local_1128 + *(float *)pcVar7 * fVar74) - fVar201;
            fVar212 = (fVar89 * fStack_1124 + fVar150 * fVar74) - fVar201;
            fVar213 = (fVar89 * fStack_1120 + fVar150 * fVar74) - fVar201;
            fVar201 = (fVar86 * fStack_111c + fVar154 * fVar74) - fVar201;
            fVar113 = (*(float *)pcVar51 * local_1128 + *(float *)pcVar3 * fVar74) - fVar207;
            fVar141 = (fVar88 * fStack_1124 + fVar185 * fVar74) - fVar207;
            fVar150 = (fVar88 * fStack_1120 + fVar185 * fVar74) - fVar207;
            fVar207 = (fVar90 * fStack_111c + fVar187 * fVar74) - fVar207;
            fVar226 = (*(float *)pcVar47 * local_1128 + *(float *)pcVar4 * fVar74) - fVar234;
            fVar227 = (fVar114 * fStack_1124 + fVar195 * fVar74) - fVar234;
            fVar229 = (fVar114 * fStack_1120 + fVar195 * fVar74) - fVar234;
            fVar234 = (fVar151 * fStack_111c + fVar216 * fVar74) - fVar234;
            fVar114 = fVar211 - fVar170;
            fVar154 = fVar212 - fVar171;
            fVar185 = fVar213 - fVar172;
            fVar187 = fVar201 - fVar173;
            fVar87 = fVar113 - local_10c8;
            fVar88 = fVar141 - fStack_10c4;
            fVar90 = fVar150 - fStack_10c0;
            fVar112 = fVar207 - fStack_10bc;
            fVar195 = fVar226 - fVar228;
            fVar216 = fVar227 - fVar230;
            fVar205 = fVar229 - fVar232;
            fVar209 = fVar234 - fVar235;
            fVar75 = *(float *)(ray + k * 4 + 0x60);
            fVar196 = fVar170 - fVar152;
            fVar200 = fVar171 - fVar153;
            fVar206 = fVar172 - fVar156;
            fVar210 = fVar173 - fVar155;
            fVar151 = local_10c8 - fVar214;
            fVar188 = fStack_10c4 - fVar215;
            fVar193 = fStack_10c0 - fVar217;
            fVar194 = fStack_10bc - fVar219;
            local_10e8 = (fVar87 * (fVar226 + fVar228) - (fVar113 + local_10c8) * fVar195) * fVar12
                         + ((fVar211 + fVar170) * fVar195 - (fVar226 + fVar228) * fVar114) * fVar140
                           + (fVar114 * (fVar113 + local_10c8) - (fVar211 + fVar170) * fVar87) *
                             fVar75;
            fStack_10e4 = (fVar88 * (fVar227 + fVar230) - (fVar141 + fStack_10c4) * fVar216) *
                          fVar12 + ((fVar212 + fVar171) * fVar216 - (fVar227 + fVar230) * fVar154) *
                                   fVar140 + (fVar154 * (fVar141 + fStack_10c4) -
                                             (fVar212 + fVar171) * fVar88) * fVar75;
            fStack_10e0 = (fVar90 * (fVar229 + fVar232) - (fVar150 + fStack_10c0) * fVar205) *
                          fVar12 + ((fVar213 + fVar172) * fVar205 - (fVar229 + fVar232) * fVar185) *
                                   fVar140 + (fVar185 * (fVar150 + fStack_10c0) -
                                             (fVar213 + fVar172) * fVar90) * fVar75;
            fStack_10dc = (fVar112 * (fVar234 + fVar235) - (fVar207 + fStack_10bc) * fVar209) *
                          fVar12 + ((fVar201 + fVar173) * fVar209 - (fVar234 + fVar235) * fVar187) *
                                   fVar140 + (fVar187 * (fVar207 + fStack_10bc) -
                                             (fVar201 + fVar173) * fVar112) * fVar75;
            local_1128 = fVar228 - fVar186;
            fStack_1124 = fVar230 - fVar199;
            fStack_1120 = fVar232 - fVar202;
            fStack_111c = fVar235 - fVar208;
            local_10d8._0_4_ =
                 (fVar151 * (fVar228 + fVar186) - (local_10c8 + fVar214) * local_1128) * fVar12 +
                 ((fVar170 + fVar152) * local_1128 - (fVar228 + fVar186) * fVar196) * fVar140 +
                 (fVar196 * (local_10c8 + fVar214) - (fVar170 + fVar152) * fVar151) * fVar75;
            local_10d8._4_4_ =
                 (fVar188 * (fVar230 + fVar199) - (fStack_10c4 + fVar215) * fStack_1124) * fVar12 +
                 ((fVar171 + fVar153) * fStack_1124 - (fVar230 + fVar199) * fVar200) * fVar140 +
                 (fVar200 * (fStack_10c4 + fVar215) - (fVar171 + fVar153) * fVar188) * fVar75;
            fStack_10d0 = (fVar193 * (fVar232 + fVar202) - (fStack_10c0 + fVar217) * fStack_1120) *
                          fVar12 + ((fVar172 + fVar156) * fStack_1120 -
                                   (fVar232 + fVar202) * fVar206) * fVar140 +
                                   (fVar206 * (fStack_10c0 + fVar217) -
                                   (fVar172 + fVar156) * fVar193) * fVar75;
            fStack_10cc = (fVar194 * (fVar235 + fVar208) - (fStack_10bc + fVar219) * fStack_111c) *
                          fVar12 + ((fVar173 + fVar155) * fStack_111c -
                                   (fVar235 + fVar208) * fVar210) * fVar140 +
                                   (fVar210 * (fStack_10bc + fVar219) -
                                   (fVar173 + fVar155) * fVar194) * fVar75;
            fVar221 = fVar152 - fVar211;
            fVar223 = fVar153 - fVar212;
            fVar224 = fVar156 - fVar213;
            fVar225 = fVar155 - fVar201;
            fVar231 = fVar214 - fVar113;
            fVar218 = fVar215 - fVar141;
            fVar220 = fVar217 - fVar150;
            fVar222 = fVar219 - fVar207;
            fVar74 = fVar186 - fVar226;
            fVar89 = fVar199 - fVar227;
            fVar76 = fVar202 - fVar229;
            fVar86 = fVar208 - fVar234;
            auVar123._0_4_ =
                 (fVar231 * (fVar226 + fVar186) - (fVar113 + fVar214) * fVar74) * fVar12 +
                 ((fVar211 + fVar152) * fVar74 - (fVar226 + fVar186) * fVar221) * fVar140 +
                 (fVar221 * (fVar113 + fVar214) - (fVar211 + fVar152) * fVar231) * fVar75;
            auVar123._4_4_ =
                 (fVar218 * (fVar227 + fVar199) - (fVar141 + fVar215) * fVar89) * fVar12 +
                 ((fVar212 + fVar153) * fVar89 - (fVar227 + fVar199) * fVar223) * fVar140 +
                 (fVar223 * (fVar141 + fVar215) - (fVar212 + fVar153) * fVar218) * fVar75;
            auVar123._8_4_ =
                 (fVar220 * (fVar229 + fVar202) - (fVar150 + fVar217) * fVar76) * fVar12 +
                 ((fVar213 + fVar156) * fVar76 - (fVar229 + fVar202) * fVar224) * fVar140 +
                 (fVar224 * (fVar150 + fVar217) - (fVar213 + fVar156) * fVar220) * fVar75;
            auVar123._12_4_ =
                 (fVar222 * (fVar234 + fVar208) - (fVar207 + fVar219) * fVar86) * fVar12 +
                 ((fVar201 + fVar155) * fVar86 - (fVar234 + fVar208) * fVar225) * fVar140 +
                 (fVar225 * (fVar207 + fVar219) - (fVar201 + fVar155) * fVar222) * fVar75;
            local_10f8._0_4_ = local_10e8 + (float)local_10d8._0_4_ + auVar123._0_4_;
            local_10f8._4_4_ = fStack_10e4 + (float)local_10d8._4_4_ + auVar123._4_4_;
            fStack_10f0 = fStack_10e0 + fStack_10d0 + auVar123._8_4_;
            fStack_10ec = fStack_10dc + fStack_10cc + auVar123._12_4_;
            auVar165._4_4_ = fStack_10e4;
            auVar165._0_4_ = local_10e8;
            auVar165._8_4_ = fStack_10e0;
            auVar165._12_4_ = fStack_10dc;
            auVar178 = minps(auVar165,_local_10d8);
            auVar178 = minps(auVar178,auVar123);
            auVar181._4_4_ = fStack_10e4;
            auVar181._0_4_ = local_10e8;
            auVar181._8_4_ = fStack_10e0;
            auVar181._12_4_ = fStack_10dc;
            auVar115 = maxps(auVar181,_local_10d8);
            auVar115 = maxps(auVar115,auVar123);
            auVar182._4_4_ = -(uint)(auVar115._4_4_ <= ABS((float)local_10f8._4_4_) * 1.1920929e-07)
            ;
            auVar182._0_4_ = -(uint)(auVar115._0_4_ <= ABS((float)local_10f8._0_4_) * 1.1920929e-07)
            ;
            auVar182._8_4_ = -(uint)(auVar115._8_4_ <= ABS(fStack_10f0) * 1.1920929e-07);
            auVar182._12_4_ = -(uint)(auVar115._12_4_ <= ABS(fStack_10ec) * 1.1920929e-07);
            auVar166._4_4_ =
                 -(uint)(-(ABS((float)local_10f8._4_4_) * 1.1920929e-07) <= auVar178._4_4_);
            auVar166._0_4_ =
                 -(uint)(-(ABS((float)local_10f8._0_4_) * 1.1920929e-07) <= auVar178._0_4_);
            auVar166._8_4_ = -(uint)(-(ABS(fStack_10f0) * 1.1920929e-07) <= auVar178._8_4_);
            auVar166._12_4_ = -(uint)(-(ABS(fStack_10ec) * 1.1920929e-07) <= auVar178._12_4_);
            auVar182 = auVar182 | auVar166;
            iVar45 = movmskps((int)&local_1220,auVar182);
            local_1218 = uVar56;
            local_1210 = uVar36;
            if (iVar45 != 0) {
              uVar64 = -(uint)(ABS(fVar231 * local_1128) <= ABS(fVar151 * fVar195));
              uVar63 = -(uint)(ABS(fVar218 * fStack_1124) <= ABS(fVar188 * fVar216));
              uVar67 = -(uint)(ABS(fVar220 * fStack_1120) <= ABS(fVar193 * fVar205));
              uVar70 = -(uint)(ABS(fVar222 * fStack_111c) <= ABS(fVar194 * fVar209));
              uVar61 = -(uint)(ABS(fVar196 * fVar74) <= ABS(fVar114 * local_1128));
              uVar65 = -(uint)(ABS(fVar200 * fVar89) <= ABS(fVar154 * fStack_1124));
              uVar68 = -(uint)(ABS(fVar206 * fVar76) <= ABS(fVar185 * fStack_1120));
              uVar71 = -(uint)(ABS(fVar210 * fVar86) <= ABS(fVar187 * fStack_111c));
              uVar62 = -(uint)(ABS(fVar221 * fVar151) <= ABS(fVar196 * fVar87));
              uVar66 = -(uint)(ABS(fVar223 * fVar188) <= ABS(fVar200 * fVar88));
              uVar69 = -(uint)(ABS(fVar224 * fVar193) <= ABS(fVar206 * fVar90));
              uVar72 = -(uint)(ABS(fVar225 * fVar194) <= ABS(fVar210 * fVar112));
              fVar113 = (float)(~uVar64 & (uint)(fVar87 * local_1128 - fVar151 * fVar195) |
                               (uint)(fVar151 * fVar74 - fVar231 * local_1128) & uVar64);
              fVar141 = (float)(~uVar63 & (uint)(fVar88 * fStack_1124 - fVar188 * fVar216) |
                               (uint)(fVar188 * fVar89 - fVar218 * fStack_1124) & uVar63);
              fVar153 = (float)(~uVar67 & (uint)(fVar90 * fStack_1120 - fVar193 * fVar205) |
                               (uint)(fVar193 * fVar76 - fVar220 * fStack_1120) & uVar67);
              fVar150 = (float)(~uVar70 & (uint)(fVar112 * fStack_111c - fVar194 * fVar209) |
                               (uint)(fVar194 * fVar86 - fVar222 * fStack_111c) & uVar70);
              auVar204._0_4_ = ~uVar61 & (uint)(fVar195 * fVar196 - fVar114 * local_1128);
              auVar204._4_4_ = ~uVar65 & (uint)(fVar216 * fVar200 - fVar154 * fStack_1124);
              auVar204._8_4_ = ~uVar68 & (uint)(fVar205 * fVar206 - fVar185 * fStack_1120);
              auVar204._12_4_ = ~uVar71 & (uint)(fVar209 * fVar210 - fVar187 * fStack_111c);
              auVar25._4_4_ = (uint)(fVar223 * fStack_1124 - fVar200 * fVar89) & uVar65;
              auVar25._0_4_ = (uint)(fVar221 * local_1128 - fVar196 * fVar74) & uVar61;
              auVar25._8_4_ = (uint)(fVar224 * fStack_1120 - fVar206 * fVar76) & uVar68;
              auVar25._12_4_ = (uint)(fVar225 * fStack_111c - fVar210 * fVar86) & uVar71;
              auVar204 = auVar204 | auVar25;
              auVar198._0_4_ = (uint)(fVar196 * fVar231 - fVar221 * fVar151) & uVar62;
              auVar198._4_4_ = (uint)(fVar200 * fVar218 - fVar223 * fVar188) & uVar66;
              auVar198._8_4_ = (uint)(fVar206 * fVar220 - fVar224 * fVar193) & uVar69;
              auVar198._12_4_ = (uint)(fVar210 * fVar222 - fVar225 * fVar194) & uVar72;
              auVar78._0_4_ = ~uVar62 & (uint)(fVar114 * fVar151 - fVar196 * fVar87);
              auVar78._4_4_ = ~uVar66 & (uint)(fVar154 * fVar188 - fVar200 * fVar88);
              auVar78._8_4_ = ~uVar69 & (uint)(fVar185 * fVar193 - fVar206 * fVar90);
              auVar78._12_4_ = ~uVar72 & (uint)(fVar187 * fVar194 - fVar210 * fVar112);
              auVar78 = auVar78 | auVar198;
              auVar124._0_4_ = fVar75 * auVar78._0_4_;
              auVar124._4_4_ = fVar75 * auVar78._4_4_;
              auVar124._8_4_ = fVar75 * auVar78._8_4_;
              auVar124._12_4_ = fVar75 * auVar78._12_4_;
              fVar75 = fVar12 * fVar113 + fVar140 * auVar204._0_4_ + auVar124._0_4_;
              fVar74 = fVar12 * fVar141 + fVar140 * auVar204._4_4_ + auVar124._4_4_;
              fVar89 = fVar12 * fVar153 + fVar140 * auVar204._8_4_ + auVar124._8_4_;
              fVar76 = fVar12 * fVar150 + fVar140 * auVar204._12_4_ + auVar124._12_4_;
              auVar167._0_4_ = fVar75 + fVar75;
              auVar167._4_4_ = fVar74 + fVar74;
              auVar167._8_4_ = fVar89 + fVar89;
              auVar167._12_4_ = fVar76 + fVar76;
              fVar89 = fVar170 * fVar113 + local_10c8 * auVar204._0_4_ + fVar228 * auVar78._0_4_;
              fVar76 = fVar171 * fVar141 + fStack_10c4 * auVar204._4_4_ + fVar230 * auVar78._4_4_;
              fVar88 = fVar172 * fVar153 + fStack_10c0 * auVar204._8_4_ + fVar232 * auVar78._8_4_;
              fVar90 = fVar173 * fVar150 + fStack_10bc * auVar204._12_4_ + fVar235 * auVar78._12_4_;
              auVar178 = rcpps(auVar124,auVar167);
              fVar75 = auVar178._0_4_;
              fVar74 = auVar178._4_4_;
              fVar86 = auVar178._8_4_;
              fVar87 = auVar178._12_4_;
              fVar89 = ((1.0 - auVar167._0_4_ * fVar75) * fVar75 + fVar75) * (fVar89 + fVar89);
              fVar76 = ((1.0 - auVar167._4_4_ * fVar74) * fVar74 + fVar74) * (fVar76 + fVar76);
              fVar86 = ((1.0 - auVar167._8_4_ * fVar86) * fVar86 + fVar86) * (fVar88 + fVar88);
              fVar87 = ((1.0 - auVar167._12_4_ * fVar87) * fVar87 + fVar87) * (fVar90 + fVar90);
              fVar75 = *(float *)(ray + k * 4 + 0x80);
              fVar74 = *(float *)(ray + k * 4 + 0x30);
              auVar125._0_4_ = -(uint)(fVar89 <= fVar75 && fVar74 <= fVar89) & auVar182._0_4_;
              auVar125._4_4_ = -(uint)(fVar76 <= fVar75 && fVar74 <= fVar76) & auVar182._4_4_;
              auVar125._8_4_ = -(uint)(fVar86 <= fVar75 && fVar74 <= fVar86) & auVar182._8_4_;
              auVar125._12_4_ = -(uint)(fVar87 <= fVar75 && fVar74 <= fVar87) & auVar182._12_4_;
              iVar45 = movmskps(iVar45,auVar125);
              if (iVar45 != 0) {
                aVar126._0_4_ = auVar125._0_4_ & -(uint)(auVar167._0_4_ != 0.0);
                aVar126._4_4_ = auVar125._4_4_ & -(uint)(auVar167._4_4_ != 0.0);
                aVar126._8_4_ = auVar125._8_4_ & -(uint)(auVar167._8_4_ != 0.0);
                aVar126._12_4_ = auVar125._12_4_ & -(uint)(auVar167._12_4_ != 0.0);
                iVar45 = movmskps(iVar45,(undefined1  [16])aVar126);
                if (iVar45 != 0) {
                  tNear.field_0.v[1] = fStack_10e4;
                  tNear.field_0.v[0] = local_10e8;
                  tNear.field_0.v[3] = fStack_10dc;
                  tNear.field_0.v[2] = fStack_10e0;
                  local_1168[0] = fVar89;
                  local_1168[1] = fVar76;
                  local_1168[2] = fVar86;
                  local_1168[3] = fVar87;
                  local_1158._4_4_ = fVar141;
                  local_1158._0_4_ = fVar113;
                  fStack_1150 = fVar153;
                  fStack_114c = fVar150;
                  local_1148 = auVar204;
                  _local_1138 = auVar78;
                  pGVar20 = (context->scene->geometries).items[uVar17].ptr;
                  if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar178 = rcpps(_local_10f8,_local_10f8);
                    fVar75 = auVar178._0_4_;
                    fVar74 = auVar178._4_4_;
                    fVar88 = auVar178._8_4_;
                    fVar90 = auVar178._12_4_;
                    fVar75 = (float)(-(uint)(1e-18 <= ABS((float)local_10f8._0_4_)) &
                                    (uint)(((float)DAT_01feca10 - (float)local_10f8._0_4_ * fVar75)
                                           * fVar75 + fVar75));
                    fVar74 = (float)(-(uint)(1e-18 <= ABS((float)local_10f8._4_4_)) &
                                    (uint)((DAT_01feca10._4_4_ - (float)local_10f8._4_4_ * fVar74) *
                                           fVar74 + fVar74));
                    fVar88 = (float)(-(uint)(1e-18 <= ABS(fStack_10f0)) &
                                    (uint)((DAT_01feca10._8_4_ - fStack_10f0 * fVar88) * fVar88 +
                                          fVar88));
                    fVar90 = (float)(-(uint)(1e-18 <= ABS(fStack_10ec)) &
                                    (uint)((DAT_01feca10._12_4_ - fStack_10ec * fVar90) * fVar90 +
                                          fVar90));
                    auVar127._0_4_ = local_10e8 * fVar75;
                    auVar127._4_4_ = fStack_10e4 * fVar74;
                    auVar127._8_4_ = fStack_10e0 * fVar88;
                    auVar127._12_4_ = fStack_10dc * fVar90;
                    auVar115 = minps(auVar127,_DAT_01feca10);
                    auVar99._0_4_ = fVar75 * (float)local_10d8._0_4_;
                    auVar99._4_4_ = fVar74 * (float)local_10d8._4_4_;
                    auVar99._8_4_ = fVar88 * fStack_10d0;
                    auVar99._12_4_ = fVar90 * fStack_10cc;
                    auVar178 = minps(auVar99,_DAT_01feca10);
                    uVar64 = *(uint *)(local_1220 + 4);
                    pcVar5 = local_1220 + uVar56 * 4;
                    uVar61 = *(uint *)pcVar5;
                    uVar62 = *(uint *)(pcVar5 + 4);
                    uVar63 = *(uint *)(local_1220 + 8);
                    uVar65 = *(uint *)(pcVar5 + 8);
                    if (uVar56 == 2) {
                      uVar63 = uVar64;
                      uVar65 = uVar62;
                    }
                    fVar112 = auVar115._0_4_;
                    fVar113 = auVar115._4_4_;
                    fVar114 = auVar115._8_4_;
                    fVar141 = auVar115._12_4_;
                    fVar75 = auVar178._0_4_;
                    fVar74 = auVar178._4_4_;
                    fVar88 = auVar178._8_4_;
                    fVar90 = auVar178._12_4_;
                    fVar151 = (1.0 - fVar112) - fVar75;
                    fVar153 = (1.0 - fVar113) - fVar74;
                    fVar150 = (1.0 - fVar114) - fVar88;
                    fVar155 = (1.0 - fVar141) - fVar90;
                    local_1178._0_4_ =
                         fVar151 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                         (float)(uVar61 >> 0x10) * 0.00012207031 * fVar75 +
                         (float)(uVar64 >> 0x10) * 0.00012207031 * fVar112;
                    local_1178._4_4_ =
                         fVar153 * (float)(uVar61 >> 0x10) * 0.00012207031 +
                         (float)(uVar62 >> 0x10) * 0.00012207031 * fVar74 +
                         (float)(uVar64 >> 0x10) * 0.00012207031 * fVar113;
                    local_1178._8_4_ =
                         fVar150 * (float)(uVar64 >> 0x10) * 0.00012207031 +
                         (float)(uVar62 >> 0x10) * 0.00012207031 * fVar88 +
                         (float)(uVar63 >> 0x10) * 0.00012207031 * fVar114;
                    local_1178._12_4_ =
                         fVar155 * (float)(uVar62 >> 0x10) * 0.00012207031 +
                         (float)(uVar65 >> 0x10) * 0.00012207031 * fVar90 +
                         (float)(uVar63 >> 0x10) * 0.00012207031 * fVar141;
                    local_1188[1] =
                         (float)(uVar61 & 0xffff) * 0.00012207031 * fVar153 +
                         (float)(uVar62 & 0xffff) * 0.00012207031 * fVar74 +
                         (float)(uVar64 & 0xffff) * 0.00012207031 * fVar113;
                    local_1188[0] =
                         (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar151 +
                         (float)(uVar61 & 0xffff) * 0.00012207031 * fVar75 +
                         (float)(uVar64 & 0xffff) * 0.00012207031 * fVar112;
                    local_1188[2] =
                         (float)(uVar64 & 0xffff) * 0.00012207031 * fVar150 +
                         (float)(uVar62 & 0xffff) * 0.00012207031 * fVar88 +
                         (float)(uVar63 & 0xffff) * 0.00012207031 * fVar114;
                    local_1188[3] =
                         (float)(uVar62 & 0xffff) * 0.00012207031 * fVar155 +
                         (float)(uVar65 & 0xffff) * 0.00012207031 * fVar90 +
                         (float)(uVar63 & 0xffff) * 0.00012207031 * fVar141;
                    auVar32._4_4_ = fVar76;
                    auVar32._0_4_ = fVar89;
                    auVar32._8_4_ = fVar86;
                    auVar32._12_4_ = fVar87;
                    auVar115 = ~(undefined1  [16])aVar126 & _DAT_01feb9f0 |
                               auVar32 & (undefined1  [16])aVar126;
                    auVar145._4_4_ = auVar115._0_4_;
                    auVar145._0_4_ = auVar115._4_4_;
                    auVar145._8_4_ = auVar115._12_4_;
                    auVar145._12_4_ = auVar115._8_4_;
                    auVar178 = minps(auVar145,auVar115);
                    auVar100._0_8_ = auVar178._8_8_;
                    auVar100._8_4_ = auVar178._0_4_;
                    auVar100._12_4_ = auVar178._4_4_;
                    auVar178 = minps(auVar100,auVar178);
                    auVar101._0_8_ =
                         CONCAT44(-(uint)(auVar178._4_4_ == auVar115._4_4_) & aVar126._4_4_,
                                  -(uint)(auVar178._0_4_ == auVar115._0_4_) & aVar126._0_4_);
                    auVar101._8_4_ = -(uint)(auVar178._8_4_ == auVar115._8_4_) & aVar126._8_4_;
                    auVar101._12_4_ = -(uint)(auVar178._12_4_ == auVar115._12_4_) & aVar126._12_4_;
                    iVar45 = movmskps(uVar46,auVar101);
                    aVar79 = aVar126;
                    if (iVar45 != 0) {
                      aVar79.i[2] = auVar101._8_4_;
                      aVar79._0_8_ = auVar101._0_8_;
                      aVar79.i[3] = auVar101._12_4_;
                    }
                    uVar46 = movmskps(iVar45,(undefined1  [16])aVar79);
                    lVar60 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                      }
                    }
                    valid.field_0 = aVar126;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar75 = local_1188[lVar60];
                      fVar74 = local_1168[lVar60 + -4];
                      uVar58 = *(undefined4 *)(local_1158 + lVar60 * 4);
                      uVar13 = *(undefined4 *)(local_1148 + lVar60 * 4);
                      uVar14 = *(undefined4 *)(local_1138 + lVar60 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_1168[lVar60];
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar58;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                      *(float *)(ray + k * 4 + 0xf0) = fVar75;
                      *(float *)(ray + k * 4 + 0x100) = fVar74;
                      *(uint *)(ray + k * 4 + 0x110) = (uint)uStack_1260;
                      *(uint *)(ray + k * 4 + 0x120) = uVar17;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_1268 = CONCAT44((uint)uStack_1260,(uint)uStack_1260);
                      uStack_1260._4_4_ = (uint)uStack_1260;
                      uVar29 = *local_1110;
                      uVar30 = local_1110[1];
                      do {
                        uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_1008 = local_1188[lVar60];
                        fVar75 = local_1168[lVar60 + -4];
                        *(float *)(ray + k * 4 + 0x80) = local_1168[lVar60];
                        args.context = context->user;
                        local_ff8._4_4_ = fVar75;
                        local_ff8._0_4_ = fVar75;
                        local_ff8._8_4_ = fVar75;
                        local_ff8._12_4_ = fVar75;
                        local_1038 = *(undefined4 *)(local_1158 + lVar60 * 4);
                        uVar13 = *(undefined4 *)(local_1148 + lVar60 * 4);
                        uVar14 = *(undefined4 *)(local_1138 + lVar60 * 4);
                        local_1028._4_4_ = uVar13;
                        local_1028._0_4_ = uVar13;
                        local_1028._8_4_ = uVar13;
                        local_1028._12_4_ = uVar13;
                        local_1018._4_4_ = uVar14;
                        local_1018._0_4_ = uVar14;
                        local_1018._8_4_ = uVar14;
                        local_1018._12_4_ = uVar14;
                        uStack_1034 = local_1038;
                        uStack_1030 = local_1038;
                        uStack_102c = local_1038;
                        fStack_1004 = local_1008;
                        fStack_1000 = local_1008;
                        fStack_ffc = local_1008;
                        local_fe8 = local_1268;
                        uStack_fe0 = uStack_1260;
                        local_fd8 = CONCAT44(uVar17,uVar17);
                        uStack_fd0 = CONCAT44(uVar17,uVar17);
                        local_fc8 = (args.context)->instID[0];
                        uStack_fc4 = local_fc8;
                        uStack_fc0 = local_fc8;
                        uStack_fbc = local_fc8;
                        local_fb8 = (args.context)->instPrimID[0];
                        uStack_fb4 = local_fb8;
                        uStack_fb0 = local_fb8;
                        uStack_fac = local_fb8;
                        args.valid = (int *)&local_1238;
                        pRVar44 = (RTCIntersectArguments *)pGVar20->userPtr;
                        args.hit = (RTCHitN *)&local_1038;
                        args.N = 4;
                        p_Var41 = pGVar20->intersectionFilterN;
                        local_1238 = uVar29;
                        uStack_1230 = uVar30;
                        args.geometryUserPtr = pRVar44;
                        args.ray = (RTCRayN *)ray;
                        if (p_Var41 != (RTCFilterFunctionN)0x0) {
                          p_Var41 = (RTCFilterFunctionN)(*p_Var41)(&args);
                        }
                        auVar83._0_4_ = -(uint)((int)local_1238 == 0);
                        auVar83._4_4_ = -(uint)(local_1238._4_4_ == 0);
                        auVar83._8_4_ = -(uint)((int)uStack_1230 == 0);
                        auVar83._12_4_ = -(uint)(uStack_1230._4_4_ == 0);
                        uVar46 = movmskps((int)p_Var41,auVar83);
                        pRVar39 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                        if ((uVar46 ^ 0xf) == 0) {
                          auVar83 = auVar83 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar44 = context->args;
                          p_Var41 = pRVar44->filter;
                          if ((p_Var41 != (RTCFilterFunctionN)0x0) &&
                             (((pRVar44->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                            p_Var41 = (RTCFilterFunctionN)(*p_Var41)(&args);
                          }
                          auVar107._0_4_ = -(uint)((int)local_1238 == 0);
                          auVar107._4_4_ = -(uint)(local_1238._4_4_ == 0);
                          auVar107._8_4_ = -(uint)((int)uStack_1230 == 0);
                          auVar107._12_4_ = -(uint)(uStack_1230._4_4_ == 0);
                          auVar83 = auVar107 ^ _DAT_01febe20;
                          uVar46 = movmskps((int)p_Var41,auVar107);
                          pRVar39 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                          if ((uVar46 ^ 0xf) != 0) {
                            auVar134._0_4_ = *(uint *)(args.ray + 0xc0) & auVar107._0_4_;
                            auVar134._4_4_ = *(uint *)(args.ray + 0xc4) & auVar107._4_4_;
                            auVar134._8_4_ = *(uint *)(args.ray + 200) & auVar107._8_4_;
                            auVar134._12_4_ = *(uint *)(args.ray + 0xcc) & auVar107._12_4_;
                            auVar192._0_4_ = ~auVar107._0_4_ & *(uint *)args.hit;
                            auVar192._4_4_ = ~auVar107._4_4_ & *(uint *)(args.hit + 4);
                            auVar192._8_4_ = ~auVar107._8_4_ & *(uint *)(args.hit + 8);
                            auVar192._12_4_ = ~auVar107._12_4_ & *(uint *)(args.hit + 0xc);
                            *(undefined1 (*) [16])(args.ray + 0xc0) = auVar192 | auVar134;
                            uVar46 = *(uint *)(args.hit + 0x14);
                            uVar64 = *(uint *)(args.hit + 0x18);
                            uVar61 = *(uint *)(args.hit + 0x1c);
                            *(uint *)(args.ray + 0xd0) =
                                 ~auVar107._0_4_ & *(uint *)(args.hit + 0x10) |
                                 *(uint *)(args.ray + 0xd0) & auVar107._0_4_;
                            *(uint *)(args.ray + 0xd4) =
                                 ~auVar107._4_4_ & uVar46 |
                                 *(uint *)(args.ray + 0xd4) & auVar107._4_4_;
                            *(uint *)(args.ray + 0xd8) =
                                 ~auVar107._8_4_ & uVar64 |
                                 *(uint *)(args.ray + 0xd8) & auVar107._8_4_;
                            *(uint *)(args.ray + 0xdc) =
                                 ~auVar107._12_4_ & uVar61 |
                                 *(uint *)(args.ray + 0xdc) & auVar107._12_4_;
                            auVar169._0_4_ = *(uint *)(args.ray + 0xe0) & auVar107._0_4_;
                            auVar169._4_4_ = *(uint *)(args.ray + 0xe4) & auVar107._4_4_;
                            auVar169._8_4_ = *(uint *)(args.ray + 0xe8) & auVar107._8_4_;
                            auVar169._12_4_ = *(uint *)(args.ray + 0xec) & auVar107._12_4_;
                            auVar135._0_4_ = ~auVar107._0_4_ & *(uint *)(args.hit + 0x20);
                            auVar135._4_4_ = ~auVar107._4_4_ & *(uint *)(args.hit + 0x24);
                            auVar135._8_4_ = ~auVar107._8_4_ & *(uint *)(args.hit + 0x28);
                            auVar135._12_4_ = ~auVar107._12_4_ & *(uint *)(args.hit + 0x2c);
                            *(undefined1 (*) [16])(args.ray + 0xe0) = auVar135 | auVar169;
                            auVar184._0_4_ = *(uint *)(args.ray + 0xf0) & auVar107._0_4_;
                            auVar184._4_4_ = *(uint *)(args.ray + 0xf4) & auVar107._4_4_;
                            auVar184._8_4_ = *(uint *)(args.ray + 0xf8) & auVar107._8_4_;
                            auVar184._12_4_ = *(uint *)(args.ray + 0xfc) & auVar107._12_4_;
                            auVar136._0_4_ = ~auVar107._0_4_ & *(uint *)(args.hit + 0x30);
                            auVar136._4_4_ = ~auVar107._4_4_ & *(uint *)(args.hit + 0x34);
                            auVar136._8_4_ = ~auVar107._8_4_ & *(uint *)(args.hit + 0x38);
                            auVar136._12_4_ = ~auVar107._12_4_ & *(uint *)(args.hit + 0x3c);
                            *(undefined1 (*) [16])(args.ray + 0xf0) = auVar136 | auVar184;
                            uVar46 = *(uint *)(args.hit + 0x44);
                            uVar64 = *(uint *)(args.hit + 0x48);
                            uVar61 = *(uint *)(args.hit + 0x4c);
                            *(uint *)(args.ray + 0x100) =
                                 ~auVar107._0_4_ & *(uint *)(args.hit + 0x40) |
                                 *(uint *)(args.ray + 0x100) & auVar107._0_4_;
                            *(uint *)(args.ray + 0x104) =
                                 ~auVar107._4_4_ & uVar46 |
                                 *(uint *)(args.ray + 0x104) & auVar107._4_4_;
                            *(uint *)(args.ray + 0x108) =
                                 ~auVar107._8_4_ & uVar64 |
                                 *(uint *)(args.ray + 0x108) & auVar107._8_4_;
                            *(uint *)(args.ray + 0x10c) =
                                 ~auVar107._12_4_ & uVar61 |
                                 *(uint *)(args.ray + 0x10c) & auVar107._12_4_;
                            uVar46 = *(uint *)(args.hit + 0x54);
                            uVar64 = *(uint *)(args.hit + 0x58);
                            uVar61 = *(uint *)(args.hit + 0x5c);
                            *(uint *)(args.ray + 0x110) =
                                 *(uint *)(args.ray + 0x110) & auVar107._0_4_ |
                                 ~auVar107._0_4_ & *(uint *)(args.hit + 0x50);
                            *(uint *)(args.ray + 0x114) =
                                 *(uint *)(args.ray + 0x114) & auVar107._4_4_ |
                                 ~auVar107._4_4_ & uVar46;
                            *(uint *)(args.ray + 0x118) =
                                 *(uint *)(args.ray + 0x118) & auVar107._8_4_ |
                                 ~auVar107._8_4_ & uVar64;
                            *(uint *)(args.ray + 0x11c) =
                                 *(uint *)(args.ray + 0x11c) & auVar107._12_4_ |
                                 ~auVar107._12_4_ & uVar61;
                            uVar46 = *(uint *)(args.hit + 100);
                            uVar64 = *(uint *)(args.hit + 0x68);
                            uVar61 = *(uint *)(args.hit + 0x6c);
                            *(uint *)(args.ray + 0x120) =
                                 *(uint *)(args.ray + 0x120) & auVar107._0_4_ |
                                 ~auVar107._0_4_ & *(uint *)(args.hit + 0x60);
                            *(uint *)(args.ray + 0x124) =
                                 *(uint *)(args.ray + 0x124) & auVar107._4_4_ |
                                 ~auVar107._4_4_ & uVar46;
                            *(uint *)(args.ray + 0x128) =
                                 *(uint *)(args.ray + 0x128) & auVar107._8_4_ |
                                 ~auVar107._8_4_ & uVar64;
                            *(uint *)(args.ray + 300) =
                                 *(uint *)(args.ray + 300) & auVar107._12_4_ |
                                 ~auVar107._12_4_ & uVar61;
                            auVar137._0_4_ = *(uint *)(args.ray + 0x130) & auVar107._0_4_;
                            auVar137._4_4_ = *(uint *)(args.ray + 0x134) & auVar107._4_4_;
                            auVar137._8_4_ = *(uint *)(args.ray + 0x138) & auVar107._8_4_;
                            auVar137._12_4_ = *(uint *)(args.ray + 0x13c) & auVar107._12_4_;
                            auVar148._0_4_ = ~auVar107._0_4_ & *(uint *)(args.hit + 0x70);
                            auVar148._4_4_ = ~auVar107._4_4_ & *(uint *)(args.hit + 0x74);
                            auVar148._8_4_ = ~auVar107._8_4_ & *(uint *)(args.hit + 0x78);
                            auVar148._12_4_ = ~auVar107._12_4_ & *(uint *)(args.hit + 0x7c);
                            *(undefined1 (*) [16])(args.ray + 0x130) = auVar148 | auVar137;
                            auVar138._0_4_ = *(uint *)(args.ray + 0x140) & auVar107._0_4_;
                            auVar138._4_4_ = *(uint *)(args.ray + 0x144) & auVar107._4_4_;
                            auVar138._8_4_ = *(uint *)(args.ray + 0x148) & auVar107._8_4_;
                            auVar138._12_4_ = *(uint *)(args.ray + 0x14c) & auVar107._12_4_;
                            auVar108._0_4_ = ~auVar107._0_4_ & *(uint *)(args.hit + 0x80);
                            auVar108._4_4_ = ~auVar107._4_4_ & *(uint *)(args.hit + 0x84);
                            auVar108._8_4_ = ~auVar107._8_4_ & *(uint *)(args.hit + 0x88);
                            auVar108._12_4_ = ~auVar107._12_4_ & *(uint *)(args.hit + 0x8c);
                            *(undefined1 (*) [16])(args.ray + 0x140) = auVar108 | auVar138;
                            pRVar39 = args.ray;
                            pRVar44 = (RTCIntersectArguments *)args.hit;
                          }
                        }
                        auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                        auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                        auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                        auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                        iVar45 = movmskps((int)pRVar39,auVar84);
                        if (iVar45 == 0) {
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar58;
                        }
                        valid.field_0.v[lVar60] = 0.0;
                        fVar75 = *(float *)(ray + k * 4 + 0x80);
                        valid.field_0.i[0] = -(uint)(fVar89 <= fVar75) & valid.field_0.i[0];
                        valid.field_0.i[1] = -(uint)(fVar76 <= fVar75) & valid.field_0.i[1];
                        valid.field_0.i[2] = -(uint)(fVar86 <= fVar75) & valid.field_0.i[2];
                        valid.field_0.i[3] = -(uint)(fVar87 <= fVar75) & valid.field_0.i[3];
                        iVar45 = movmskps(iVar45,(undefined1  [16])valid.field_0);
                        if (iVar45 != 0) {
                          auVar109._0_4_ = valid.field_0.i[0] & (uint)fVar89;
                          auVar109._4_4_ = valid.field_0.i[1] & (uint)fVar76;
                          auVar109._8_4_ = valid.field_0.i[2] & (uint)fVar86;
                          auVar109._12_4_ = valid.field_0.i[3] & (uint)fVar87;
                          auVar139._0_8_ =
                               CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                               0x7f8000007f800000;
                          auVar139._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                          auVar139._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                          auVar139 = auVar139 | auVar109;
                          auVar149._4_4_ = auVar139._0_4_;
                          auVar149._0_4_ = auVar139._4_4_;
                          auVar149._8_4_ = auVar139._12_4_;
                          auVar149._12_4_ = auVar139._8_4_;
                          auVar178 = minps(auVar149,auVar139);
                          auVar110._0_8_ = auVar178._8_8_;
                          auVar110._8_4_ = auVar178._0_4_;
                          auVar110._12_4_ = auVar178._4_4_;
                          auVar178 = minps(auVar110,auVar178);
                          auVar111._0_8_ =
                               CONCAT44(-(uint)(auVar178._4_4_ == auVar139._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar178._0_4_ == auVar139._0_4_) &
                                        valid.field_0.i[0]);
                          auVar111._8_4_ =
                               -(uint)(auVar178._8_4_ == auVar139._8_4_) & valid.field_0.i[2];
                          auVar111._12_4_ =
                               -(uint)(auVar178._12_4_ == auVar139._12_4_) & valid.field_0.i[3];
                          iVar42 = movmskps((int)pRVar44,auVar111);
                          aVar85 = valid.field_0;
                          if (iVar42 != 0) {
                            aVar85.i[2] = auVar111._8_4_;
                            aVar85._0_8_ = auVar111._0_8_;
                            aVar85.i[3] = auVar111._12_4_;
                          }
                          uVar58 = movmskps(iVar42,(undefined1  [16])aVar85);
                          uVar56 = CONCAT44((int)((ulong)pRVar44 >> 0x20),uVar58);
                          lVar60 = 0;
                          if (uVar56 != 0) {
                            for (; (uVar56 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                            }
                          }
                        }
                      } while ((char)iVar45 != '\0');
                    }
                  }
                }
              }
            }
          }
          sVar38 = 0;
          uVar56 = local_1108;
          uVar59 = local_1100;
          fVar74 = local_1058;
          fVar88 = fStack_1054;
          fVar90 = fStack_1050;
          fVar112 = fStack_104c;
          fVar89 = local_1068;
          fVar113 = fStack_1064;
          fVar114 = fStack_1060;
          fVar141 = fStack_105c;
          fVar76 = local_1078;
          fVar151 = fStack_1074;
          fVar153 = fStack_1070;
          fVar150 = fStack_106c;
          fVar86 = local_1088;
          fVar155 = fStack_1084;
          fVar154 = fStack_1080;
          fVar188 = fStack_107c;
          fVar87 = local_1098;
          fVar185 = fStack_1094;
          fVar193 = fStack_1090;
          fVar187 = fStack_108c;
          iVar45 = local_10a8;
          iVar42 = iStack_10a4;
          iVar233 = iStack_10a0;
          iVar236 = iStack_109c;
          fVar75 = local_1048;
          fVar194 = fStack_1044;
          fVar195 = fStack_1040;
          fVar196 = fStack_103c;
        }
        else {
          sVar38 = ((*(GridSOA **)(sVar57 & 0xfffffffffffffff0))->troot).ptr;
          (local_1228->super_Precalculations).grid = *(GridSOA **)(sVar57 & 0xfffffffffffffff0);
        }
        uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar178._4_4_ = uVar58;
        auVar178._0_4_ = uVar58;
        auVar178._8_4_ = uVar58;
        auVar178._12_4_ = uVar58;
        if (sVar38 != 0) {
          (pSVar55->ptr).ptr = sVar38;
          pSVar55->dist = 0;
          pSVar55 = pSVar55 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }